

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::sse2::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::sse2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  RTCRayQueryFlags *pRVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  long lVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined3 uVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  bool bVar18;
  undefined8 uVar19;
  RTCFeatureFlags RVar20;
  undefined1 auVar21 [16];
  undefined6 uVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  bool bVar38;
  byte bVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  RTCFilterFunctionN p_Var43;
  RayHitK<4> *pRVar44;
  int iVar45;
  ulong uVar46;
  RTCIntersectArguments *pRVar47;
  RTCIntersectArguments *pRVar48;
  uint uVar49;
  LinearSpace3fa *pLVar50;
  uint uVar51;
  uint uVar52;
  int iVar53;
  uint uVar54;
  uint uVar55;
  short sVar56;
  float t1;
  float fVar57;
  float fVar58;
  undefined2 uVar88;
  float fVar89;
  float fVar91;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  float fVar90;
  float fVar92;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar93;
  float fVar107;
  float fVar108;
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar109;
  float fVar126;
  float fVar127;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar128;
  float fVar140;
  float fVar141;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  float fVar142;
  float fVar147;
  float fVar148;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar149;
  float fVar163;
  float fVar164;
  vfloat4 a;
  undefined1 auVar150 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar165;
  float fVar176;
  float fVar177;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar178;
  float fVar196;
  float fVar197;
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar198;
  float fVar209;
  float fVar210;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar211;
  float fVar218;
  float fVar219;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar220;
  float fVar225;
  float fVar226;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar238;
  float fVar241;
  vfloat4 a_1;
  undefined1 auVar230 [16];
  float fVar244;
  undefined1 auVar233 [16];
  float fVar239;
  float fVar240;
  float fVar242;
  float fVar243;
  float fVar245;
  float fVar246;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar247;
  float fVar248;
  float fVar253;
  float fVar255;
  float fVar257;
  undefined1 auVar249 [16];
  float fVar254;
  float fVar256;
  float fVar258;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar259;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float fStack_520;
  float fStack_51c;
  undefined8 local_508;
  undefined8 local_4e8;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 *local_440;
  ulong local_438;
  long local_430;
  RTCFilterFunctionNArguments local_428;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  uint auStack_308 [4];
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  undefined1 local_e8 [12];
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  RTCIntersectArguments local_78;
  ulong auStack_58 [5];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 uVar87;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar138 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  
  PVar5 = prim[1];
  uVar40 = (ulong)(byte)PVar5;
  pPVar4 = prim + uVar40 * 0x19 + 6;
  fVar127 = *(float *)(pPVar4 + 0xc);
  fVar128 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar127;
  fVar140 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar127;
  fVar141 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar127;
  fVar109 = *(float *)(ray + k * 4 + 0x40) * fVar127;
  fVar126 = *(float *)(ray + k * 4 + 0x50) * fVar127;
  fVar127 = *(float *)(ray + k * 4 + 0x60) * fVar127;
  uVar6 = *(undefined4 *)(prim + uVar40 * 4 + 6);
  uVar87 = (undefined1)((uint)uVar6 >> 0x18);
  uVar88 = CONCAT11(uVar87,uVar87);
  uVar87 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar88,uVar87),CONCAT14(uVar87,uVar6));
  uVar87 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar87),uVar87);
  sVar56 = CONCAT11((char)uVar6,(char)uVar6);
  uVar41 = CONCAT62(uVar22,sVar56);
  auVar156._8_4_ = 0;
  auVar156._0_8_ = uVar41;
  auVar156._12_2_ = uVar88;
  auVar156._14_2_ = uVar88;
  uVar88 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._8_2_ = 0;
  auVar155._0_8_ = uVar41;
  auVar155._10_2_ = uVar88;
  auVar66._10_6_ = auVar155._10_6_;
  auVar66._8_2_ = uVar88;
  auVar66._0_8_ = uVar41;
  uVar88 = (undefined2)uVar22;
  auVar23._4_8_ = auVar66._8_8_;
  auVar23._2_2_ = uVar88;
  auVar23._0_2_ = uVar88;
  fVar93 = (float)((int)sVar56 >> 8);
  fVar107 = (float)(auVar23._0_4_ >> 0x18);
  fVar108 = (float)(auVar66._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar40 * 5 + 6);
  uVar87 = (undefined1)((uint)uVar6 >> 0x18);
  uVar88 = CONCAT11(uVar87,uVar87);
  uVar87 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar88,uVar87),CONCAT14(uVar87,uVar6));
  uVar87 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar87),uVar87);
  sVar56 = CONCAT11((char)uVar6,(char)uVar6);
  uVar41 = CONCAT62(uVar22,sVar56);
  auVar59._8_4_ = 0;
  auVar59._0_8_ = uVar41;
  auVar59._12_2_ = uVar88;
  auVar59._14_2_ = uVar88;
  uVar88 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar267._12_4_ = auVar59._12_4_;
  auVar267._8_2_ = 0;
  auVar267._0_8_ = uVar41;
  auVar267._10_2_ = uVar88;
  auVar113._10_6_ = auVar267._10_6_;
  auVar113._8_2_ = uVar88;
  auVar113._0_8_ = uVar41;
  uVar88 = (undefined2)uVar22;
  auVar24._4_8_ = auVar113._8_8_;
  auVar24._2_2_ = uVar88;
  auVar24._0_2_ = uVar88;
  fVar142 = (float)((int)sVar56 >> 8);
  fVar147 = (float)(auVar24._0_4_ >> 0x18);
  fVar148 = (float)(auVar113._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar40 * 6 + 6);
  uVar87 = (undefined1)((uint)uVar6 >> 0x18);
  uVar88 = CONCAT11(uVar87,uVar87);
  uVar87 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar88,uVar87),CONCAT14(uVar87,uVar6));
  uVar87 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar87),uVar87);
  sVar56 = CONCAT11((char)uVar6,(char)uVar6);
  uVar41 = CONCAT62(uVar22,sVar56);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar41;
  auVar62._12_2_ = uVar88;
  auVar62._14_2_ = uVar88;
  uVar88 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar41;
  auVar61._10_2_ = uVar88;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar88;
  auVar60._0_8_ = uVar41;
  uVar88 = (undefined2)uVar22;
  auVar25._4_8_ = auVar60._8_8_;
  auVar25._2_2_ = uVar88;
  auVar25._0_2_ = uVar88;
  fVar165 = (float)((int)sVar56 >> 8);
  fVar176 = (float)(auVar25._0_4_ >> 0x18);
  fVar177 = (float)(auVar60._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar40 * 0xb + 6);
  uVar87 = (undefined1)((uint)uVar6 >> 0x18);
  uVar88 = CONCAT11(uVar87,uVar87);
  uVar87 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar88,uVar87),CONCAT14(uVar87,uVar6));
  uVar87 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar87),uVar87);
  sVar56 = CONCAT11((char)uVar6,(char)uVar6);
  uVar41 = CONCAT62(uVar22,sVar56);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar41;
  auVar65._12_2_ = uVar88;
  auVar65._14_2_ = uVar88;
  uVar88 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar41;
  auVar64._10_2_ = uVar88;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar88;
  auVar63._0_8_ = uVar41;
  uVar88 = (undefined2)uVar22;
  auVar26._4_8_ = auVar63._8_8_;
  auVar26._2_2_ = uVar88;
  auVar26._0_2_ = uVar88;
  fVar57 = (float)((int)sVar56 >> 8);
  fVar89 = (float)(auVar26._0_4_ >> 0x18);
  fVar91 = (float)(auVar63._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  uVar87 = (undefined1)((uint)uVar6 >> 0x18);
  uVar88 = CONCAT11(uVar87,uVar87);
  uVar87 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar88,uVar87),CONCAT14(uVar87,uVar6));
  uVar87 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar87),uVar87);
  sVar56 = CONCAT11((char)uVar6,(char)uVar6);
  uVar41 = CONCAT62(uVar22,sVar56);
  auVar152._8_4_ = 0;
  auVar152._0_8_ = uVar41;
  auVar152._12_2_ = uVar88;
  auVar152._14_2_ = uVar88;
  uVar88 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar151._12_4_ = auVar152._12_4_;
  auVar151._8_2_ = 0;
  auVar151._0_8_ = uVar41;
  auVar151._10_2_ = uVar88;
  auVar150._10_6_ = auVar151._10_6_;
  auVar150._8_2_ = uVar88;
  auVar150._0_8_ = uVar41;
  uVar88 = (undefined2)uVar22;
  auVar27._4_8_ = auVar150._8_8_;
  auVar27._2_2_ = uVar88;
  auVar27._0_2_ = uVar88;
  fVar149 = (float)((int)sVar56 >> 8);
  fVar163 = (float)(auVar27._0_4_ >> 0x18);
  fVar164 = (float)(auVar150._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + (uint)(byte)PVar5 * 0xc + uVar40 + 6);
  uVar87 = (undefined1)((uint)uVar6 >> 0x18);
  uVar88 = CONCAT11(uVar87,uVar87);
  uVar87 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar88,uVar87),CONCAT14(uVar87,uVar6));
  uVar87 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar87),uVar87);
  sVar56 = CONCAT11((char)uVar6,(char)uVar6);
  uVar41 = CONCAT62(uVar22,sVar56);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar41;
  auVar181._12_2_ = uVar88;
  auVar181._14_2_ = uVar88;
  uVar88 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar41;
  auVar180._10_2_ = uVar88;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar88;
  auVar179._0_8_ = uVar41;
  uVar88 = (undefined2)uVar22;
  auVar28._4_8_ = auVar179._8_8_;
  auVar28._2_2_ = uVar88;
  auVar28._0_2_ = uVar88;
  fVar211 = (float)((int)sVar56 >> 8);
  fVar218 = (float)(auVar28._0_4_ >> 0x18);
  fVar219 = (float)(auVar179._8_4_ >> 0x18);
  uVar42 = (ulong)(uint)((int)(uVar40 * 9) * 2);
  uVar6 = *(undefined4 *)(prim + uVar42 + 6);
  uVar87 = (undefined1)((uint)uVar6 >> 0x18);
  uVar88 = CONCAT11(uVar87,uVar87);
  uVar87 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar88,uVar87),CONCAT14(uVar87,uVar6));
  uVar87 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar87),uVar87);
  sVar56 = CONCAT11((char)uVar6,(char)uVar6);
  uVar41 = CONCAT62(uVar22,sVar56);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar41;
  auVar184._12_2_ = uVar88;
  auVar184._14_2_ = uVar88;
  uVar88 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar41;
  auVar183._10_2_ = uVar88;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar88;
  auVar182._0_8_ = uVar41;
  uVar88 = (undefined2)uVar22;
  auVar29._4_8_ = auVar182._8_8_;
  auVar29._2_2_ = uVar88;
  auVar29._0_2_ = uVar88;
  fVar198 = (float)((int)sVar56 >> 8);
  fVar209 = (float)(auVar29._0_4_ >> 0x18);
  fVar210 = (float)(auVar182._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar42 + uVar40 + 6);
  uVar87 = (undefined1)((uint)uVar6 >> 0x18);
  uVar88 = CONCAT11(uVar87,uVar87);
  uVar87 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar88,uVar87),CONCAT14(uVar87,uVar6));
  uVar87 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar87),uVar87);
  sVar56 = CONCAT11((char)uVar6,(char)uVar6);
  uVar41 = CONCAT62(uVar22,sVar56);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar41;
  auVar187._12_2_ = uVar88;
  auVar187._14_2_ = uVar88;
  uVar88 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar41;
  auVar186._10_2_ = uVar88;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar88;
  auVar185._0_8_ = uVar41;
  uVar88 = (undefined2)uVar22;
  auVar30._4_8_ = auVar185._8_8_;
  auVar30._2_2_ = uVar88;
  auVar30._0_2_ = uVar88;
  fVar220 = (float)((int)sVar56 >> 8);
  fVar225 = (float)(auVar30._0_4_ >> 0x18);
  fVar226 = (float)(auVar185._8_4_ >> 0x18);
  uVar46 = (ulong)(uint)((int)(uVar40 * 5) << 2);
  uVar6 = *(undefined4 *)(prim + uVar46 + 6);
  uVar87 = (undefined1)((uint)uVar6 >> 0x18);
  uVar88 = CONCAT11(uVar87,uVar87);
  uVar87 = (undefined1)((uint)uVar6 >> 0x10);
  uVar19 = CONCAT35(CONCAT21(uVar88,uVar87),CONCAT14(uVar87,uVar6));
  uVar87 = (undefined1)((uint)uVar6 >> 8);
  uVar22 = CONCAT51(CONCAT41((int)((ulong)uVar19 >> 0x20),uVar87),uVar87);
  sVar56 = CONCAT11((char)uVar6,(char)uVar6);
  uVar41 = CONCAT62(uVar22,sVar56);
  auVar232._8_4_ = 0;
  auVar232._0_8_ = uVar41;
  auVar232._12_2_ = uVar88;
  auVar232._14_2_ = uVar88;
  uVar88 = (undefined2)((ulong)uVar19 >> 0x20);
  auVar231._12_4_ = auVar232._12_4_;
  auVar231._8_2_ = 0;
  auVar231._0_8_ = uVar41;
  auVar231._10_2_ = uVar88;
  auVar230._10_6_ = auVar231._10_6_;
  auVar230._8_2_ = uVar88;
  auVar230._0_8_ = uVar41;
  uVar88 = (undefined2)uVar22;
  auVar31._4_8_ = auVar230._8_8_;
  auVar31._2_2_ = uVar88;
  auVar31._0_2_ = uVar88;
  fVar58 = (float)((int)sVar56 >> 8);
  fVar90 = (float)(auVar31._0_4_ >> 0x18);
  fVar92 = (float)(auVar230._8_4_ >> 0x18);
  fVar247 = fVar109 * fVar93 + fVar126 * fVar142 + fVar127 * fVar165;
  fVar253 = fVar109 * fVar107 + fVar126 * fVar147 + fVar127 * fVar176;
  fVar255 = fVar109 * fVar108 + fVar126 * fVar148 + fVar127 * fVar177;
  fVar257 = fVar109 * (float)(auVar155._12_4_ >> 0x18) +
            fVar126 * (float)(auVar267._12_4_ >> 0x18) + fVar127 * (float)(auVar61._12_4_ >> 0x18);
  fVar227 = fVar109 * fVar57 + fVar126 * fVar149 + fVar127 * fVar211;
  fVar238 = fVar109 * fVar89 + fVar126 * fVar163 + fVar127 * fVar218;
  fVar241 = fVar109 * fVar91 + fVar126 * fVar164 + fVar127 * fVar219;
  fVar244 = fVar109 * (float)(auVar64._12_4_ >> 0x18) +
            fVar126 * (float)(auVar151._12_4_ >> 0x18) + fVar127 * (float)(auVar180._12_4_ >> 0x18);
  fVar178 = fVar109 * fVar198 + fVar126 * fVar220 + fVar127 * fVar58;
  fVar196 = fVar109 * fVar209 + fVar126 * fVar225 + fVar127 * fVar90;
  fVar197 = fVar109 * fVar210 + fVar126 * fVar226 + fVar127 * fVar92;
  fVar109 = fVar109 * (float)(auVar183._12_4_ >> 0x18) +
            fVar126 * (float)(auVar186._12_4_ >> 0x18) + fVar127 * (float)(auVar231._12_4_ >> 0x18);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar142 = fVar93 * fVar128 + fVar142 * fVar140 + fVar165 * fVar141;
  fVar147 = fVar107 * fVar128 + fVar147 * fVar140 + fVar176 * fVar141;
  fVar148 = fVar108 * fVar128 + fVar148 * fVar140 + fVar177 * fVar141;
  fVar165 = (float)(auVar155._12_4_ >> 0x18) * fVar128 +
            (float)(auVar267._12_4_ >> 0x18) * fVar140 + (float)(auVar61._12_4_ >> 0x18) * fVar141;
  fVar176 = fVar57 * fVar128 + fVar149 * fVar140 + fVar211 * fVar141;
  fVar177 = fVar89 * fVar128 + fVar163 * fVar140 + fVar218 * fVar141;
  fVar211 = fVar91 * fVar128 + fVar164 * fVar140 + fVar219 * fVar141;
  fVar218 = (float)(auVar64._12_4_ >> 0x18) * fVar128 +
            (float)(auVar151._12_4_ >> 0x18) * fVar140 + (float)(auVar180._12_4_ >> 0x18) * fVar141;
  fVar149 = fVar128 * fVar198 + fVar140 * fVar220 + fVar141 * fVar58;
  fVar163 = fVar128 * fVar209 + fVar140 * fVar225 + fVar141 * fVar90;
  fVar164 = fVar128 * fVar210 + fVar140 * fVar226 + fVar141 * fVar92;
  fVar128 = fVar128 * (float)(auVar183._12_4_ >> 0x18) +
            fVar140 * (float)(auVar186._12_4_ >> 0x18) + fVar141 * (float)(auVar231._12_4_ >> 0x18);
  fVar127 = (float)DAT_01ff1d40;
  fVar57 = DAT_01ff1d40._4_4_;
  fVar58 = DAT_01ff1d40._8_4_;
  fVar89 = DAT_01ff1d40._12_4_;
  uVar51 = -(uint)(fVar127 <= ABS(fVar247));
  uVar52 = -(uint)(fVar57 <= ABS(fVar253));
  uVar54 = -(uint)(fVar58 <= ABS(fVar255));
  uVar55 = -(uint)(fVar89 <= ABS(fVar257));
  auVar249._0_4_ = (uint)fVar247 & uVar51;
  auVar249._4_4_ = (uint)fVar253 & uVar52;
  auVar249._8_4_ = (uint)fVar255 & uVar54;
  auVar249._12_4_ = (uint)fVar257 & uVar55;
  auVar143._0_4_ = ~uVar51 & (uint)fVar127;
  auVar143._4_4_ = ~uVar52 & (uint)fVar57;
  auVar143._8_4_ = ~uVar54 & (uint)fVar58;
  auVar143._12_4_ = ~uVar55 & (uint)fVar89;
  auVar143 = auVar143 | auVar249;
  uVar51 = -(uint)(fVar127 <= ABS(fVar227));
  uVar52 = -(uint)(fVar57 <= ABS(fVar238));
  uVar54 = -(uint)(fVar58 <= ABS(fVar241));
  uVar55 = -(uint)(fVar89 <= ABS(fVar244));
  auVar233._0_4_ = (uint)fVar227 & uVar51;
  auVar233._4_4_ = (uint)fVar238 & uVar52;
  auVar233._8_4_ = (uint)fVar241 & uVar54;
  auVar233._12_4_ = (uint)fVar244 & uVar55;
  auVar153._0_4_ = ~uVar51 & (uint)fVar127;
  auVar153._4_4_ = ~uVar52 & (uint)fVar57;
  auVar153._8_4_ = ~uVar54 & (uint)fVar58;
  auVar153._12_4_ = ~uVar55 & (uint)fVar89;
  auVar153 = auVar153 | auVar233;
  uVar51 = -(uint)(fVar127 <= ABS(fVar178));
  uVar52 = -(uint)(fVar57 <= ABS(fVar196));
  uVar54 = -(uint)(fVar58 <= ABS(fVar197));
  uVar55 = -(uint)(fVar89 <= ABS(fVar109));
  auVar188._0_4_ = (uint)fVar178 & uVar51;
  auVar188._4_4_ = (uint)fVar196 & uVar52;
  auVar188._8_4_ = (uint)fVar197 & uVar54;
  auVar188._12_4_ = (uint)fVar109 & uVar55;
  auVar166._0_4_ = ~uVar51 & (uint)fVar127;
  auVar166._4_4_ = ~uVar52 & (uint)fVar57;
  auVar166._8_4_ = ~uVar54 & (uint)fVar58;
  auVar166._12_4_ = ~uVar55 & (uint)fVar89;
  auVar166 = auVar166 | auVar188;
  auVar66 = rcpps(_DAT_01ff1d40,auVar143);
  fVar127 = auVar66._0_4_;
  fVar89 = auVar66._4_4_;
  fVar92 = auVar66._8_4_;
  fVar108 = auVar66._12_4_;
  fVar127 = (1.0 - auVar143._0_4_ * fVar127) * fVar127 + fVar127;
  fVar89 = (1.0 - auVar143._4_4_ * fVar89) * fVar89 + fVar89;
  fVar92 = (1.0 - auVar143._8_4_ * fVar92) * fVar92 + fVar92;
  fVar108 = (1.0 - auVar143._12_4_ * fVar108) * fVar108 + fVar108;
  auVar66 = rcpps(auVar66,auVar153);
  fVar57 = auVar66._0_4_;
  fVar90 = auVar66._4_4_;
  fVar93 = auVar66._8_4_;
  fVar109 = auVar66._12_4_;
  fVar57 = (1.0 - auVar153._0_4_ * fVar57) * fVar57 + fVar57;
  fVar90 = (1.0 - auVar153._4_4_ * fVar90) * fVar90 + fVar90;
  fVar93 = (1.0 - auVar153._8_4_ * fVar93) * fVar93 + fVar93;
  fVar109 = (1.0 - auVar153._12_4_ * fVar109) * fVar109 + fVar109;
  auVar66 = rcpps(auVar66,auVar166);
  fVar58 = auVar66._0_4_;
  fVar91 = auVar66._4_4_;
  fVar107 = auVar66._8_4_;
  fVar126 = auVar66._12_4_;
  fVar58 = (1.0 - auVar166._0_4_ * fVar58) * fVar58 + fVar58;
  fVar91 = (1.0 - auVar166._4_4_ * fVar91) * fVar91 + fVar91;
  fVar107 = (1.0 - auVar166._8_4_ * fVar107) * fVar107 + fVar107;
  fVar126 = (1.0 - auVar166._12_4_ * fVar126) * fVar126 + fVar126;
  uVar41 = *(ulong *)(prim + uVar40 * 7 + 6);
  uVar88 = (undefined2)(uVar41 >> 0x30);
  auVar69._8_4_ = 0;
  auVar69._0_8_ = uVar41;
  auVar69._12_2_ = uVar88;
  auVar69._14_2_ = uVar88;
  uVar88 = (undefined2)(uVar41 >> 0x20);
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._8_2_ = 0;
  auVar68._0_8_ = uVar41;
  auVar68._10_2_ = uVar88;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._8_2_ = uVar88;
  auVar67._0_8_ = uVar41;
  uVar88 = (undefined2)(uVar41 >> 0x10);
  auVar32._4_8_ = auVar67._8_8_;
  auVar32._2_2_ = uVar88;
  auVar32._0_2_ = uVar88;
  auVar144._0_8_ =
       CONCAT44(((float)(auVar32._0_4_ >> 0x10) - fVar147) * fVar89,
                ((float)(int)(short)uVar41 - fVar142) * fVar127);
  auVar144._8_4_ = ((float)(auVar67._8_4_ >> 0x10) - fVar148) * fVar92;
  auVar144._12_4_ = ((float)(auVar68._12_4_ >> 0x10) - fVar165) * fVar108;
  uVar41 = *(ulong *)(prim + uVar40 * 9 + 6);
  uVar88 = (undefined2)(uVar41 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar41;
  auVar72._12_2_ = uVar88;
  auVar72._14_2_ = uVar88;
  uVar88 = (undefined2)(uVar41 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar41;
  auVar71._10_2_ = uVar88;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar88;
  auVar70._0_8_ = uVar41;
  uVar88 = (undefined2)(uVar41 >> 0x10);
  auVar33._4_8_ = auVar70._8_8_;
  auVar33._2_2_ = uVar88;
  auVar33._0_2_ = uVar88;
  auVar167._0_4_ = ((float)(int)(short)uVar41 - fVar142) * fVar127;
  auVar167._4_4_ = ((float)(auVar33._0_4_ >> 0x10) - fVar147) * fVar89;
  auVar167._8_4_ = ((float)(auVar70._8_4_ >> 0x10) - fVar148) * fVar92;
  auVar167._12_4_ = ((float)(auVar71._12_4_ >> 0x10) - fVar165) * fVar108;
  uVar41 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar40 * -2 + 6);
  uVar88 = (undefined2)(uVar42 >> 0x30);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar42;
  auVar96._12_2_ = uVar88;
  auVar96._14_2_ = uVar88;
  uVar88 = (undefined2)(uVar42 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar42;
  auVar95._10_2_ = uVar88;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar88;
  auVar94._0_8_ = uVar42;
  uVar88 = (undefined2)(uVar42 >> 0x10);
  auVar34._4_8_ = auVar94._8_8_;
  auVar34._2_2_ = uVar88;
  auVar34._0_2_ = uVar88;
  auVar97._0_8_ =
       CONCAT44(((float)(auVar34._0_4_ >> 0x10) - fVar177) * fVar90,
                ((float)(int)(short)uVar42 - fVar176) * fVar57);
  auVar97._8_4_ = ((float)(auVar94._8_4_ >> 0x10) - fVar211) * fVar93;
  auVar97._12_4_ = ((float)(auVar95._12_4_ >> 0x10) - fVar218) * fVar109;
  uVar88 = (undefined2)(uVar41 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar41;
  auVar75._12_2_ = uVar88;
  auVar75._14_2_ = uVar88;
  uVar88 = (undefined2)(uVar41 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar41;
  auVar74._10_2_ = uVar88;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar88;
  auVar73._0_8_ = uVar41;
  uVar88 = (undefined2)(uVar41 >> 0x10);
  auVar35._4_8_ = auVar73._8_8_;
  auVar35._2_2_ = uVar88;
  auVar35._0_2_ = uVar88;
  auVar199._0_4_ = ((float)(int)(short)uVar41 - fVar176) * fVar57;
  auVar199._4_4_ = ((float)(auVar35._0_4_ >> 0x10) - fVar177) * fVar90;
  auVar199._8_4_ = ((float)(auVar73._8_4_ >> 0x10) - fVar211) * fVar93;
  auVar199._12_4_ = ((float)(auVar74._12_4_ >> 0x10) - fVar218) * fVar109;
  uVar41 = *(ulong *)(prim + uVar46 + uVar40 + 6);
  uVar88 = (undefined2)(uVar41 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar41;
  auVar78._12_2_ = uVar88;
  auVar78._14_2_ = uVar88;
  uVar88 = (undefined2)(uVar41 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar41;
  auVar77._10_2_ = uVar88;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar88;
  auVar76._0_8_ = uVar41;
  uVar88 = (undefined2)(uVar41 >> 0x10);
  auVar36._4_8_ = auVar76._8_8_;
  auVar36._2_2_ = uVar88;
  auVar36._0_2_ = uVar88;
  auVar79._0_8_ =
       CONCAT44(((float)(auVar36._0_4_ >> 0x10) - fVar163) * fVar91,
                ((float)(int)(short)uVar41 - fVar149) * fVar58);
  auVar79._8_4_ = ((float)(auVar76._8_4_ >> 0x10) - fVar164) * fVar107;
  auVar79._12_4_ = ((float)(auVar77._12_4_ >> 0x10) - fVar128) * fVar126;
  uVar41 = *(ulong *)(prim + uVar40 * 0x17 + 6);
  uVar88 = (undefined2)(uVar41 >> 0x30);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar41;
  auVar191._12_2_ = uVar88;
  auVar191._14_2_ = uVar88;
  uVar88 = (undefined2)(uVar41 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar41;
  auVar190._10_2_ = uVar88;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar88;
  auVar189._0_8_ = uVar41;
  uVar88 = (undefined2)(uVar41 >> 0x10);
  auVar37._4_8_ = auVar189._8_8_;
  auVar37._2_2_ = uVar88;
  auVar37._0_2_ = uVar88;
  auVar192._0_4_ = ((float)(int)(short)uVar41 - fVar149) * fVar58;
  auVar192._4_4_ = ((float)(auVar37._0_4_ >> 0x10) - fVar163) * fVar91;
  auVar192._8_4_ = ((float)(auVar189._8_4_ >> 0x10) - fVar164) * fVar107;
  auVar192._12_4_ = ((float)(auVar190._12_4_ >> 0x10) - fVar128) * fVar126;
  auVar154._8_4_ = auVar144._8_4_;
  auVar154._0_8_ = auVar144._0_8_;
  auVar154._12_4_ = auVar144._12_4_;
  auVar155 = minps(auVar154,auVar167);
  auVar110._8_4_ = auVar97._8_4_;
  auVar110._0_8_ = auVar97._0_8_;
  auVar110._12_4_ = auVar97._12_4_;
  auVar66 = minps(auVar110,auVar199);
  auVar155 = maxps(auVar155,auVar66);
  auVar111._8_4_ = auVar79._8_4_;
  auVar111._0_8_ = auVar79._0_8_;
  auVar111._12_4_ = auVar79._12_4_;
  auVar66 = minps(auVar111,auVar192);
  auVar129._4_4_ = uVar6;
  auVar129._0_4_ = uVar6;
  auVar129._8_4_ = uVar6;
  auVar129._12_4_ = uVar6;
  auVar66 = maxps(auVar66,auVar129);
  auVar156 = maxps(auVar155,auVar66);
  auVar155 = maxps(auVar144,auVar167);
  auVar66 = maxps(auVar97,auVar199);
  auVar155 = minps(auVar155,auVar66);
  local_2d8 = auVar156._0_4_ * 0.99999964;
  fStack_2d4 = auVar156._4_4_ * 0.99999964;
  fStack_2d0 = auVar156._8_4_ * 0.99999964;
  fStack_2cc = auVar156._12_4_ * 0.99999964;
  auVar66 = maxps(auVar79,auVar192);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar98._4_4_ = uVar6;
  auVar98._0_4_ = uVar6;
  auVar98._8_4_ = uVar6;
  auVar98._12_4_ = uVar6;
  auVar66 = minps(auVar66,auVar98);
  auVar66 = minps(auVar155,auVar66);
  auVar99._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && local_2d8 <= auVar66._0_4_ * 1.0000004);
  auVar99._4_4_ = -(uint)(1 < (byte)PVar5 && fStack_2d4 <= auVar66._4_4_ * 1.0000004);
  auVar99._8_4_ = -(uint)(2 < (byte)PVar5 && fStack_2d0 <= auVar66._8_4_ * 1.0000004);
  auVar99._12_4_ = -(uint)(3 < (byte)PVar5 && fStack_2cc <= auVar66._12_4_ * 1.0000004);
  uVar51 = movmskps((uint)(byte)PVar5,auVar99);
  if (uVar51 == 0) {
    return;
  }
  uVar51 = uVar51 & 0xff;
  pLVar50 = pre->ray_space + k;
  local_278._0_12_ = mm_lookupmask_ps._240_12_;
  local_278._12_4_ = 0;
  local_440 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
LAB_00b50553:
  lVar10 = 0;
  if ((ulong)uVar51 != 0) {
    for (; (uVar51 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  uVar52 = *(uint *)(prim + 2);
  local_2f8 = *(uint *)(prim + lVar10 * 4 + 6);
  local_438 = (ulong)local_2f8;
  pGVar7 = (context->scene->geometries).items[uVar52].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar41 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_438 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  pfVar1 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar41);
  fVar127 = *pfVar1;
  fVar57 = pfVar1[1];
  fVar58 = pfVar1[2];
  fVar89 = pfVar1[3];
  lVar10 = uVar41 + 1;
  pfVar1 = (float *)(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar10);
  fVar90 = *pfVar1;
  fVar91 = pfVar1[1];
  fVar92 = pfVar1[2];
  fVar93 = pfVar1[3];
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var9 + (long)pGVar7[2].userPtr * uVar41);
  fVar107 = *pfVar1;
  fVar108 = pfVar1[1];
  fVar109 = pfVar1[2];
  fVar126 = pfVar1[3];
  pfVar1 = (float *)(_Var9 + (long)pGVar7[2].userPtr * lVar10);
  fVar142 = *pfVar1;
  fVar147 = pfVar1[1];
  fVar148 = pfVar1[2];
  fVar165 = pfVar1[3];
  pfVar1 = (float *)((long)pGVar7[3].userPtr + uVar41 * *(long *)&pGVar7[3].fnumTimeSegments);
  pfVar2 = (float *)((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar10);
  pRVar48 = (RTCIntersectArguments *)pGVar7[2].intersectionFilterN;
  pRVar3 = (RTCRayQueryFlags *)((long)&pRVar48->flags + (long)pGVar7[2].pointQueryFunc * uVar41);
  local_1c8 = *(float *)(ray + k * 4);
  fStack_1c4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1c0 = *(float *)(ray + k * 4 + 0x20);
  fVar149 = (float)*pRVar3 * 0.33333334 + fVar127;
  fVar163 = (float)pRVar3[1] * 0.33333334 + fVar57;
  fVar164 = (float)pRVar3[2] * 0.33333334 + fVar58;
  fVar128 = (float)pRVar3[3] * 0.33333334 + fVar89;
  pRVar3 = (RTCRayQueryFlags *)((long)&pRVar48->flags + (long)pGVar7[2].pointQueryFunc * lVar10);
  fVar178 = fVar90 - (float)*pRVar3 * 0.33333334;
  fVar197 = fVar91 - (float)pRVar3[1] * 0.33333334;
  fVar209 = fVar92 - (float)pRVar3[2] * 0.33333334;
  fVar211 = fVar93 - (float)pRVar3[3] * 0.33333334;
  fVar219 = *pfVar1 * 0.33333334 + fVar107;
  fVar220 = pfVar1[1] * 0.33333334 + fVar108;
  fVar225 = pfVar1[2] * 0.33333334 + fVar109;
  fVar226 = pfVar1[3] * 0.33333334 + fVar126;
  fVar227 = fVar142 - *pfVar2 * 0.33333334;
  fVar238 = fVar147 - pfVar2[1] * 0.33333334;
  fVar241 = fVar148 - pfVar2[2] * 0.33333334;
  fVar244 = fVar165 - pfVar2[3] * 0.33333334;
  fVar140 = fVar178 * 0.0;
  fVar141 = fVar197 * 0.0;
  fVar176 = fVar209 * 0.0;
  fVar177 = fVar211 * 0.0;
  fVar247 = fVar90 * 0.0 + fVar140;
  fVar253 = fVar91 * 0.0 + fVar141;
  fVar255 = fVar92 * 0.0 + fVar176;
  fVar257 = fVar93 * 0.0 + fVar177;
  fVar228 = fVar149 * 0.0;
  fVar239 = fVar163 * 0.0;
  fVar242 = fVar164 * 0.0;
  fVar245 = fVar128 * 0.0;
  fVar196 = fVar228 + fVar247 + fVar127;
  fVar198 = fVar239 + fVar253 + fVar57;
  fVar210 = fVar242 + fVar255 + fVar58;
  fVar218 = fVar245 + fVar257 + fVar89;
  fVar149 = (fVar149 * 3.0 + fVar247) - fVar127 * 3.0;
  fVar163 = (fVar163 * 3.0 + fVar253) - fVar57 * 3.0;
  fVar164 = (fVar164 * 3.0 + fVar255) - fVar58 * 3.0;
  fVar128 = (fVar128 * 3.0 + fVar257) - fVar89 * 3.0;
  fVar229 = fVar227 * 0.0;
  fVar240 = fVar238 * 0.0;
  fVar243 = fVar241 * 0.0;
  fVar246 = fVar244 * 0.0;
  fVar247 = fVar142 * 0.0 + fVar229;
  fVar253 = fVar147 * 0.0 + fVar240;
  fVar255 = fVar148 * 0.0 + fVar243;
  fVar257 = fVar165 * 0.0 + fVar246;
  fVar248 = fVar219 * 0.0;
  fVar254 = fVar220 * 0.0;
  fVar256 = fVar225 * 0.0;
  fVar258 = fVar226 * 0.0;
  fVar259 = fVar248 + fVar247 + fVar107;
  fVar263 = fVar254 + fVar253 + fVar108;
  fVar264 = fVar256 + fVar255 + fVar109;
  fVar265 = fVar258 + fVar257 + fVar126;
  fVar219 = (fVar219 * 3.0 + fVar247) - fVar107 * 3.0;
  fVar220 = (fVar220 * 3.0 + fVar253) - fVar108 * 3.0;
  fVar225 = (fVar225 * 3.0 + fVar255) - fVar109 * 3.0;
  fVar226 = (fVar226 * 3.0 + fVar257) - fVar126 * 3.0;
  fVar140 = fVar140 + fVar90 + fVar228 + fVar127 * 0.0;
  fVar141 = fVar141 + fVar91 + fVar239 + fVar57 * 0.0;
  fVar176 = fVar176 + fVar92 + fVar242 + fVar58 * 0.0;
  fVar177 = fVar177 + fVar93 + fVar245 + fVar89 * 0.0;
  fVar127 = ((fVar90 * 3.0 - fVar178 * 3.0) + fVar228) - fVar127 * 0.0;
  fVar57 = ((fVar91 * 3.0 - fVar197 * 3.0) + fVar239) - fVar57 * 0.0;
  fVar58 = ((fVar92 * 3.0 - fVar209 * 3.0) + fVar242) - fVar58 * 0.0;
  fVar89 = ((fVar93 * 3.0 - fVar211 * 3.0) + fVar245) - fVar89 * 0.0;
  fVar178 = fVar229 + fVar142 + fVar248 + fVar107 * 0.0;
  fVar197 = fVar240 + fVar147 + fVar254 + fVar108 * 0.0;
  fVar209 = fVar243 + fVar148 + fVar256 + fVar109 * 0.0;
  fVar211 = fVar246 + fVar165 + fVar258 + fVar126 * 0.0;
  fVar90 = ((fVar142 * 3.0 - fVar227 * 3.0) + fVar248) - fVar107 * 0.0;
  fVar91 = ((fVar147 * 3.0 - fVar238 * 3.0) + fVar254) - fVar108 * 0.0;
  fVar92 = ((fVar148 * 3.0 - fVar241 * 3.0) + fVar256) - fVar109 * 0.0;
  fVar93 = ((fVar165 * 3.0 - fVar244 * 3.0) + fVar258) - fVar126 * 0.0;
  fVar227 = fVar163 * fVar259 - fVar263 * fVar149;
  fVar241 = fVar164 * fVar263 - fVar264 * fVar163;
  fVar244 = fVar149 * fVar264 - fVar259 * fVar164;
  fVar247 = fVar128 * fVar265 - fVar265 * fVar128;
  fVar108 = fVar163 * fVar219 - fVar220 * fVar149;
  fVar142 = fVar164 * fVar220 - fVar225 * fVar163;
  fVar148 = fVar149 * fVar225 - fVar219 * fVar164;
  fVar165 = fVar57 * fVar178 - fVar197 * fVar127;
  fVar197 = fVar58 * fVar197 - fVar209 * fVar57;
  fVar209 = fVar127 * fVar209 - fVar178 * fVar58;
  fVar211 = fVar89 * fVar211 - fVar211 * fVar89;
  fVar107 = fVar57 * fVar90 - fVar91 * fVar127;
  fVar91 = fVar58 * fVar91 - fVar92 * fVar57;
  fVar126 = fVar127 * fVar92 - fVar90 * fVar58;
  fVar220 = fVar244 * fVar244 + fVar241 * fVar241 + fVar227 * fVar227;
  auVar155 = ZEXT416((uint)fVar220);
  auVar66 = rsqrtss(ZEXT416((uint)fVar220),auVar155);
  fVar90 = auVar66._0_4_;
  fVar225 = fVar90 * 1.5 - fVar90 * fVar90 * fVar220 * 0.5 * fVar90;
  fVar253 = fVar227 * fVar108 + fVar244 * fVar148 + fVar241 * fVar142;
  fVar90 = fVar247 * fVar225;
  auVar66 = rcpss(auVar155,auVar155);
  fVar92 = (2.0 - fVar220 * auVar66._0_4_) * auVar66._0_4_;
  fVar219 = fVar209 * fVar209 + fVar197 * fVar197 + fVar165 * fVar165;
  auVar66 = ZEXT416((uint)fVar219);
  auVar155 = rsqrtss(ZEXT416((uint)fVar219),auVar66);
  fVar109 = auVar155._0_4_;
  fVar178 = fVar109 * 1.5 - fVar109 * fVar109 * fVar219 * 0.5 * fVar109;
  fVar238 = fVar165 * fVar107 + fVar209 * fVar126 + fVar197 * fVar91;
  fVar147 = fVar211 * fVar178;
  auVar66 = rcpss(auVar66,auVar66);
  fVar109 = (2.0 - fVar219 * auVar66._0_4_) * auVar66._0_4_;
  local_3b8 = fVar218 * fVar241 * fVar225;
  fStack_3b4 = fVar218 * fVar244 * fVar225;
  fStack_3b0 = fVar218 * fVar227 * fVar225;
  fStack_3ac = fVar218 * fVar90;
  local_3c8 = fVar196 - local_3b8;
  fStack_3c4 = fVar198 - fStack_3b4;
  fStack_3c0 = fVar210 - fStack_3b0;
  fStack_3bc = fVar218 - fStack_3ac;
  fVar241 = fVar218 * fVar92 * (fVar220 * fVar142 - fVar253 * fVar241) * fVar225 +
            fVar128 * fVar241 * fVar225;
  fVar244 = fVar218 * fVar92 * (fVar220 * fVar148 - fVar253 * fVar244) * fVar225 +
            fVar128 * fVar244 * fVar225;
  fVar227 = fVar218 * fVar92 * (fVar220 * fVar108 - fVar253 * fVar227) * fVar225 +
            fVar128 * fVar227 * fVar225;
  fVar220 = fVar218 * fVar92 * (fVar220 * (fVar128 * fVar226 - fVar226 * fVar128) -
                               fVar253 * fVar247) * fVar225 + fVar128 * fVar90;
  local_3b8 = local_3b8 + fVar196;
  fStack_3b4 = fStack_3b4 + fVar198;
  fStack_3b0 = fStack_3b0 + fVar210;
  fStack_3ac = fStack_3ac + fVar218;
  fVar92 = fVar177 * fVar197 * fVar178;
  fVar108 = fVar177 * fVar209 * fVar178;
  fVar142 = fVar177 * fVar165 * fVar178;
  fVar148 = fVar177 * fVar147;
  local_3e8 = fVar140 - fVar92;
  fStack_3e4 = fVar141 - fVar108;
  fStack_3e0 = fVar176 - fVar142;
  fStack_3dc = fVar177 - fVar148;
  fVar90 = fVar177 * fVar109 * (fVar219 * fVar91 - fVar238 * fVar197) * fVar178 +
           fVar89 * fVar197 * fVar178;
  fVar91 = fVar177 * fVar109 * (fVar219 * fVar126 - fVar238 * fVar209) * fVar178 +
           fVar89 * fVar209 * fVar178;
  fVar107 = fVar177 * fVar109 * (fVar219 * fVar107 - fVar238 * fVar165) * fVar178 +
            fVar89 * fVar165 * fVar178;
  fVar126 = fVar177 * fVar109 * (fVar219 * (fVar89 * fVar93 - fVar93 * fVar89) - fVar238 * fVar211)
                      * fVar178 + fVar89 * fVar147;
  fVar92 = fVar92 + fVar140;
  fVar108 = fVar108 + fVar141;
  fVar142 = fVar142 + fVar176;
  fVar148 = fVar148 + fVar177;
  local_3d8 = (fVar149 - fVar241) * 0.33333334 + local_3c8;
  fStack_3d4 = (fVar163 - fVar244) * 0.33333334 + fStack_3c4;
  fStack_3d0 = (fVar164 - fVar227) * 0.33333334 + fStack_3c0;
  fStack_3cc = (fVar128 - fVar220) * 0.33333334 + fStack_3bc;
  local_3f8 = local_3e8 - (fVar127 - fVar90) * 0.33333334;
  fStack_3f4 = fStack_3e4 - (fVar57 - fVar91) * 0.33333334;
  fStack_3f0 = fStack_3e0 - (fVar58 - fVar107) * 0.33333334;
  fStack_3ec = fStack_3dc - (fVar89 - fVar126) * 0.33333334;
  fVar93 = fVar92 - (fVar90 + fVar127) * 0.33333334;
  fVar109 = fVar108 - (fVar91 + fVar57) * 0.33333334;
  fVar147 = fVar142 - (fVar107 + fVar58) * 0.33333334;
  fVar165 = fVar148 - (fVar126 + fVar89) * 0.33333334;
  local_158 = local_3c8 - local_1c8;
  fStack_154 = fStack_3c4 - fStack_1c4;
  fStack_150 = fStack_3c0 - fStack_1c0;
  fStack_14c = fStack_3bc - 0.0;
  fVar127 = (pLVar50->vx).field_0.m128[0];
  fVar57 = (pLVar50->vx).field_0.m128[1];
  fVar58 = (pLVar50->vy).field_0.m128[0];
  fVar89 = (pLVar50->vy).field_0.m128[1];
  fVar90 = (pLVar50->vz).field_0.m128[0];
  fVar91 = (pLVar50->vz).field_0.m128[1];
  fVar107 = local_158 * fVar127 + fStack_154 * fVar58 + fStack_150 * fVar90;
  fVar126 = local_158 * fVar57 + fStack_154 * fVar89 + fStack_150 * fVar91;
  local_168 = local_3d8 - local_1c8;
  fStack_164 = fStack_3d4 - fStack_1c4;
  fStack_160 = fStack_3d0 - fStack_1c0;
  fStack_15c = fStack_3cc - 0.0;
  fVar197 = local_168 * fVar127 + fStack_164 * fVar58 + fStack_160 * fVar90;
  fVar198 = local_168 * fVar57 + fStack_164 * fVar89 + fStack_160 * fVar91;
  local_318 = CONCAT44(fVar198,fVar197);
  local_178 = local_3f8 - local_1c8;
  fStack_174 = fStack_3f4 - fStack_1c4;
  fStack_170 = fStack_3f0 - fStack_1c0;
  fStack_16c = fStack_3ec - 0.0;
  fVar178 = local_178 * fVar127 + fStack_174 * fVar58 + fStack_170 * fVar90;
  fVar196 = local_178 * fVar57 + fStack_174 * fVar89 + fStack_170 * fVar91;
  local_328 = CONCAT44(fVar196,fVar178);
  local_188 = local_3e8 - local_1c8;
  fStack_184 = fStack_3e4 - fStack_1c4;
  fStack_180 = fStack_3e0 - fStack_1c0;
  fStack_17c = fStack_3dc - 0.0;
  fVar176 = local_188 * fVar127 + fStack_184 * fVar58 + fStack_180 * fVar90;
  fVar177 = local_188 * fVar57 + fStack_184 * fVar89 + fStack_180 * fVar91;
  local_338 = CONCAT44(fVar177,fVar176);
  local_198 = local_3b8 - local_1c8;
  fStack_194 = fStack_3b4 - fStack_1c4;
  fStack_190 = fStack_3b0 - fStack_1c0;
  fStack_18c = fStack_3ac - 0.0;
  fVar140 = local_198 * fVar127 + fStack_194 * fVar58 + fStack_190 * fVar90;
  fVar141 = local_198 * fVar57 + fStack_194 * fVar89 + fStack_190 * fVar91;
  local_288 = (fVar241 + fVar149) * 0.33333334 + local_3b8;
  fStack_284 = (fVar244 + fVar163) * 0.33333334 + fStack_3b4;
  fStack_280 = (fVar227 + fVar164) * 0.33333334 + fStack_3b0;
  fStack_27c = (fVar220 + fVar128) * 0.33333334 + fStack_3ac;
  local_1a8 = local_288 - local_1c8;
  fStack_1a4 = fStack_284 - fStack_1c4;
  fStack_1a0 = fStack_280 - fStack_1c0;
  fStack_19c = fStack_27c - 0.0;
  fVar164 = local_1a8 * fVar127 + fStack_1a4 * fVar58 + fStack_1a0 * fVar90;
  fVar128 = local_1a8 * fVar57 + fStack_1a4 * fVar89 + fStack_1a0 * fVar91;
  local_358 = CONCAT44(fVar128,fVar164);
  local_1b8 = fVar93 - local_1c8;
  fStack_1b4 = fVar109 - fStack_1c4;
  fStack_1b0 = fVar147 - fStack_1c0;
  fStack_1ac = fVar165 - 0.0;
  fVar149 = local_1b8 * fVar127 + fStack_1b4 * fVar58 + fStack_1b0 * fVar90;
  fVar163 = local_1b8 * fVar57 + fStack_1b4 * fVar89 + fStack_1b0 * fVar91;
  local_1c8 = fVar92 - local_1c8;
  fStack_1c4 = fVar108 - fStack_1c4;
  fStack_1c0 = fVar142 - fStack_1c0;
  fStack_1bc = fVar148 - 0.0;
  fVar127 = local_1c8 * fVar127 + fStack_1c4 * fVar58 + fStack_1c0 * fVar90;
  fVar57 = local_1c8 * fVar57 + fStack_1c4 * fVar89 + fStack_1c0 * fVar91;
  local_378 = CONCAT44(fVar57,fVar127);
  auVar234._8_8_ = local_358;
  auVar234._0_8_ = local_318;
  register0x000012c8 = local_378;
  local_388 = local_338;
  auVar80._8_4_ = fVar140;
  auVar80._0_8_ = CONCAT44(fVar126,fVar107);
  auVar80._12_4_ = fVar141;
  auVar66 = minps(auVar80,auVar234);
  auVar100._8_4_ = fVar149;
  auVar100._0_8_ = local_328;
  auVar100._12_4_ = fVar163;
  auVar155 = minps(auVar100,_local_388);
  auVar66 = minps(auVar66,auVar155);
  auVar101._8_4_ = fVar140;
  auVar101._0_8_ = CONCAT44(fVar126,fVar107);
  auVar101._12_4_ = fVar141;
  auVar155 = maxps(auVar101,auVar234);
  auVar112._4_4_ = fVar196;
  auVar112._0_4_ = fVar178;
  auVar112._8_4_ = fVar149;
  auVar112._12_4_ = fVar163;
  auVar113 = maxps(auVar112,_local_388);
  auVar156 = maxps(auVar155,auVar113);
  auVar11._4_8_ = auVar113._8_8_;
  auVar11._0_4_ = auVar66._4_4_;
  auVar114._0_8_ = auVar11._0_8_ << 0x20;
  auVar114._8_4_ = auVar66._8_4_;
  auVar114._12_4_ = auVar66._12_4_;
  auVar115._8_8_ = auVar66._8_8_;
  auVar115._0_8_ = auVar114._8_8_;
  auVar155 = minps(auVar66,auVar115);
  auVar12._4_8_ = auVar66._8_8_;
  auVar12._0_4_ = auVar156._4_4_;
  auVar116._0_8_ = auVar12._0_8_ << 0x20;
  auVar116._8_4_ = auVar156._8_4_;
  auVar116._12_4_ = auVar156._12_4_;
  auVar117._8_8_ = auVar156._8_8_;
  auVar117._0_8_ = auVar116._8_8_;
  auVar66 = maxps(auVar156,auVar117);
  auVar81._0_8_ = auVar155._0_8_ & 0x7fffffff7fffffff;
  auVar81._8_4_ = auVar155._8_4_ & 0x7fffffff;
  auVar81._12_4_ = auVar155._12_4_ & 0x7fffffff;
  auVar102._0_8_ = auVar66._0_8_ & 0x7fffffff7fffffff;
  auVar102._8_4_ = auVar66._8_4_ & 0x7fffffff;
  auVar102._12_4_ = auVar66._12_4_ & 0x7fffffff;
  auVar66 = maxps(auVar81,auVar102);
  fStack_144 = auVar66._4_4_;
  local_258 = fStack_144;
  if (fStack_144 <= auVar66._0_4_) {
    local_258 = auVar66._0_4_;
  }
  local_430 = (ulong)uVar51 + 0xf;
  local_258 = local_258 * 9.536743e-07;
  fStack_254 = local_258;
  fStack_250 = local_258;
  fStack_24c = local_258;
  local_268 = -local_258;
  fStack_264 = -local_258;
  fStack_260 = -local_258;
  fStack_25c = -local_258;
  local_118 = fVar197 - fVar107;
  fStack_114 = fVar198 - fVar126;
  fStack_110 = fVar164 - fVar140;
  fStack_10c = fVar128 - fVar141;
  local_128 = fVar178 - fVar197;
  fStack_124 = fVar196 - fVar198;
  fStack_120 = fVar149 - fVar164;
  fStack_11c = fVar163 - fVar128;
  local_138 = fVar176 - fVar178;
  fStack_134 = fVar177 - fVar196;
  fStack_130 = fVar127 - fVar149;
  fStack_12c = fVar57 - fVar163;
  local_298 = local_3b8 - local_3c8;
  fStack_294 = fStack_3b4 - fStack_3c4;
  fStack_290 = fStack_3b0 - fStack_3c0;
  fStack_28c = fStack_3ac - fStack_3bc;
  local_2a8 = local_288 - local_3d8;
  fStack_2a4 = fStack_284 - fStack_3d4;
  fStack_2a0 = fStack_280 - fStack_3d0;
  fStack_29c = fStack_27c - fStack_3cc;
  local_2b8 = fVar93 - local_3f8;
  fStack_2b4 = fVar109 - fStack_3f4;
  fStack_2b0 = fVar147 - fStack_3f0;
  fStack_2ac = fVar165 - fStack_3ec;
  local_2c8 = fVar92 - local_3e8;
  fStack_2c4 = fVar108 - fStack_3e4;
  fStack_2c0 = fVar142 - fStack_3e0;
  fStack_2bc = fVar148 - fStack_3dc;
  local_2e8 = uVar52;
  uStack_2e4 = uVar52;
  uStack_2e0 = uVar52;
  uStack_2dc = uVar52;
  uStack_2f4 = local_2f8;
  uStack_2f0 = local_2f8;
  uStack_2ec = local_2f8;
  uVar54 = 0;
  fVar127 = *(float *)(ray + k * 4 + 0x30);
  _local_538 = ZEXT816(0x3f80000000000000);
  local_4e8 = 0x3f80000000000000;
  local_148 = local_258;
  fStack_140 = fStack_144;
  fStack_13c = fStack_144;
  uStack_370 = local_378;
  uStack_350 = local_358;
  uStack_330 = local_338;
  uStack_320 = local_328;
  uStack_310 = local_318;
  local_348 = fVar140;
  fStack_344 = fVar141;
  fStack_340 = fVar140;
  fStack_33c = fVar141;
  local_368 = fVar149;
  fStack_364 = fVar163;
  fStack_360 = fVar149;
  fStack_35c = fVar163;
  do {
    fVar57 = 1.0 - (float)local_538._0_4_;
    fVar58 = 1.0 - (float)local_538._0_4_;
    fVar89 = 1.0 - (float)local_538._4_4_;
    fVar90 = 1.0 - (float)local_538._4_4_;
    fVar148 = fVar107 * fVar57 + local_348 * (float)local_538._0_4_;
    fVar165 = fVar126 * fVar58 + fStack_344 * (float)local_538._0_4_;
    fVar225 = fVar107 * fVar89 + fStack_340 * (float)local_538._4_4_;
    fVar227 = fVar126 * fVar90 + fStack_33c * (float)local_538._4_4_;
    fVar210 = (float)local_318 * fVar57 + (float)local_358 * (float)local_538._0_4_;
    fVar219 = local_318._4_4_ * fVar58 + local_358._4_4_ * (float)local_538._0_4_;
    fVar244 = (float)uStack_310 * fVar89 + (float)uStack_350 * (float)local_538._4_4_;
    fVar229 = uStack_310._4_4_ * fVar90 + uStack_350._4_4_ * (float)local_538._4_4_;
    fVar247 = (float)local_328 * fVar57 + local_368 * (float)local_538._0_4_;
    fVar253 = local_328._4_4_ * fVar58 + fStack_364 * (float)local_538._0_4_;
    fVar239 = (float)uStack_320 * fVar89 + fStack_360 * (float)local_538._4_4_;
    fVar243 = uStack_320._4_4_ * fVar90 + fStack_35c * (float)local_538._4_4_;
    fVar255 = fVar57 * (float)local_338 + (float)local_538._0_4_ * (float)local_378;
    fVar257 = fVar58 * local_338._4_4_ + (float)local_538._0_4_ * local_378._4_4_;
    fVar264 = fVar89 * (float)uStack_330 + (float)local_538._4_4_ * (float)uStack_370;
    fVar265 = fVar90 * uStack_330._4_4_ + (float)local_538._4_4_ * uStack_370._4_4_;
    fVar57 = (local_4e8._4_4_ - (float)local_4e8) * 0.11111111;
    fVar245 = (local_4e8._4_4_ - (float)local_4e8) * 0.0 + (float)local_4e8;
    fVar246 = (local_4e8._4_4_ - (float)local_4e8) * 0.33333334 + (float)local_4e8;
    fVar248 = (local_4e8._4_4_ - (float)local_4e8) * 0.6666667 + (float)local_4e8;
    fVar254 = (local_4e8._4_4_ - (float)local_4e8) * 1.0 + (float)local_4e8;
    fVar256 = 1.0 - fVar245;
    fVar258 = 1.0 - fVar246;
    fVar259 = 1.0 - fVar248;
    fVar263 = 1.0 - fVar254;
    fVar91 = fVar210 * fVar256 + fVar247 * fVar245;
    fVar176 = fVar210 * fVar258 + fVar247 * fVar246;
    fVar177 = fVar210 * fVar259 + fVar247 * fVar248;
    fVar209 = fVar210 * fVar263 + fVar247 * fVar254;
    fVar220 = fVar219 * fVar256 + fVar253 * fVar245;
    fVar226 = fVar219 * fVar258 + fVar253 * fVar246;
    fVar238 = fVar219 * fVar259 + fVar253 * fVar248;
    fVar241 = fVar219 * fVar263 + fVar253 * fVar254;
    fVar58 = (fVar148 * fVar256 + fVar210 * fVar245) * fVar256 + fVar245 * fVar91;
    fVar89 = (fVar148 * fVar258 + fVar210 * fVar246) * fVar258 + fVar246 * fVar176;
    fVar90 = (fVar148 * fVar259 + fVar210 * fVar248) * fVar259 + fVar248 * fVar177;
    fVar148 = (fVar148 * fVar263 + fVar210 * fVar254) * fVar263 + fVar254 * fVar209;
    fVar210 = (fVar165 * fVar256 + fVar219 * fVar245) * fVar256 + fVar245 * fVar220;
    fVar211 = (fVar165 * fVar258 + fVar219 * fVar246) * fVar258 + fVar246 * fVar226;
    fVar218 = (fVar165 * fVar259 + fVar219 * fVar248) * fVar259 + fVar248 * fVar238;
    fVar219 = (fVar165 * fVar263 + fVar219 * fVar254) * fVar263 + fVar254 * fVar241;
    fVar165 = fVar91 * fVar256 + (fVar247 * fVar256 + fVar255 * fVar245) * fVar245;
    fVar91 = fVar176 * fVar258 + (fVar247 * fVar258 + fVar255 * fVar246) * fVar246;
    fVar176 = fVar177 * fVar259 + (fVar247 * fVar259 + fVar255 * fVar248) * fVar248;
    fVar177 = fVar209 * fVar263 + (fVar247 * fVar263 + fVar255 * fVar254) * fVar254;
    fVar209 = fVar220 * fVar256 + (fVar253 * fVar256 + fVar257 * fVar245) * fVar245;
    fVar220 = fVar226 * fVar258 + (fVar253 * fVar258 + fVar257 * fVar246) * fVar246;
    fVar226 = fVar238 * fVar259 + (fVar253 * fVar259 + fVar257 * fVar248) * fVar248;
    fVar238 = fVar241 * fVar263 + (fVar253 * fVar263 + fVar257 * fVar254) * fVar254;
    local_3a8 = fVar256 * fVar58 + fVar245 * fVar165;
    fStack_3a4 = fVar258 * fVar89 + fVar246 * fVar91;
    fStack_3a0 = fVar259 * fVar90 + fVar248 * fVar176;
    fStack_39c = fVar263 * fVar148 + fVar254 * fVar177;
    local_398 = fVar256 * fVar210 + fVar245 * fVar209;
    fStack_394 = fVar258 * fVar211 + fVar246 * fVar220;
    fStack_390 = fVar259 * fVar218 + fVar248 * fVar226;
    fStack_38c = fVar263 * fVar219 + fVar254 * fVar238;
    fVar89 = (fVar91 - fVar89) * 3.0 * fVar57;
    fVar91 = (fVar176 - fVar90) * 3.0 * fVar57;
    fVar148 = (fVar177 - fVar148) * 3.0 * fVar57;
    fVar176 = (fVar220 - fVar211) * 3.0 * fVar57;
    fVar177 = (fVar226 - fVar218) * 3.0 * fVar57;
    fVar219 = (fVar238 - fVar219) * 3.0 * fVar57;
    local_1f8._4_4_ = fStack_3a0;
    local_1f8._0_4_ = fStack_3a4;
    local_1d8._4_4_ = fStack_390;
    local_1d8._0_4_ = fStack_394;
    fVar211 = local_3a8 + (fVar165 - fVar58) * 3.0 * fVar57;
    fVar218 = fStack_3a4 + fVar89;
    fVar220 = fStack_3a0 + fVar91;
    fVar226 = fStack_39c + fVar148;
    fVar58 = local_398 + (fVar209 - fVar210) * 3.0 * fVar57;
    fVar90 = fStack_394 + fVar176;
    fStack_520 = fStack_390 + fVar177;
    fStack_51c = fStack_38c + fVar219;
    fVar89 = fStack_3a4 - fVar89;
    fVar91 = fStack_3a0 - fVar91;
    fVar148 = fStack_39c - fVar148;
    local_1d8._8_4_ = fStack_38c;
    local_1d8._12_4_ = 0;
    local_1e8._0_4_ = fStack_394 - fVar176;
    local_1e8._4_4_ = fStack_390 - fVar177;
    local_1e8._8_4_ = fStack_38c - fVar219;
    local_1e8._12_4_ = 0;
    fVar165 = fVar244 * fVar256 + fVar239 * fVar245;
    fVar176 = fVar244 * fVar258 + fVar239 * fVar246;
    fVar177 = fVar244 * fVar259 + fVar239 * fVar248;
    fVar209 = fVar244 * fVar263 + fVar239 * fVar254;
    fVar210 = fVar229 * fVar256 + fVar243 * fVar245;
    fVar219 = fVar229 * fVar258 + fVar243 * fVar246;
    fVar240 = fVar229 * fVar259 + fVar243 * fVar248;
    fVar242 = fVar229 * fVar263 + fVar243 * fVar254;
    fVar253 = (fVar225 * fVar256 + fVar244 * fVar245) * fVar256 + fVar245 * fVar165;
    fVar255 = (fVar225 * fVar258 + fVar244 * fVar246) * fVar258 + fVar246 * fVar176;
    fVar257 = (fVar225 * fVar259 + fVar244 * fVar248) * fVar259 + fVar248 * fVar177;
    fVar228 = (fVar225 * fVar263 + fVar244 * fVar254) * fVar263 + fVar254 * fVar209;
    fVar247 = (fVar227 * fVar256 + fVar229 * fVar245) * fVar256 + fVar245 * fVar210;
    fVar238 = (fVar227 * fVar258 + fVar229 * fVar246) * fVar258 + fVar246 * fVar219;
    fVar241 = (fVar227 * fVar259 + fVar229 * fVar248) * fVar259 + fVar248 * fVar240;
    fVar244 = (fVar227 * fVar263 + fVar229 * fVar254) * fVar263 + fVar254 * fVar242;
    fVar165 = fVar165 * fVar256 + (fVar239 * fVar256 + fVar264 * fVar245) * fVar245;
    fVar176 = fVar176 * fVar258 + (fVar239 * fVar258 + fVar264 * fVar246) * fVar246;
    fVar177 = fVar177 * fVar259 + (fVar239 * fVar259 + fVar264 * fVar248) * fVar248;
    fVar209 = fVar209 * fVar263 + (fVar239 * fVar263 + fVar264 * fVar254) * fVar254;
    fVar229 = fVar210 * fVar256 + (fVar243 * fVar256 + fVar265 * fVar245) * fVar245;
    fVar239 = fVar219 * fVar258 + (fVar243 * fVar258 + fVar265 * fVar246) * fVar246;
    fVar240 = fVar240 * fVar259 + (fVar243 * fVar259 + fVar265 * fVar248) * fVar248;
    fVar242 = fVar242 * fVar263 + (fVar243 * fVar263 + fVar265 * fVar254) * fVar254;
    fVar210 = fVar256 * fVar253 + fVar245 * fVar165;
    fVar219 = fVar258 * fVar255 + fVar246 * fVar176;
    fVar225 = fVar259 * fVar257 + fVar248 * fVar177;
    fVar227 = fVar263 * fVar228 + fVar254 * fVar209;
    fVar243 = fVar256 * fVar247 + fVar245 * fVar229;
    fVar245 = fVar258 * fVar238 + fVar246 * fVar239;
    fVar246 = fVar259 * fVar241 + fVar248 * fVar240;
    fVar248 = fVar263 * fVar244 + fVar254 * fVar242;
    fVar176 = (fVar176 - fVar255) * 3.0 * fVar57;
    fVar177 = (fVar177 - fVar257) * 3.0 * fVar57;
    fVar209 = (fVar209 - fVar228) * 3.0 * fVar57;
    fVar255 = (fVar239 - fVar238) * 3.0 * fVar57;
    fVar257 = (fVar240 - fVar241) * 3.0 * fVar57;
    fVar228 = (fVar242 - fVar244) * 3.0 * fVar57;
    local_208._4_4_ = fVar225;
    local_208._0_4_ = fVar219;
    local_208._8_4_ = fVar227;
    local_208._12_4_ = 0;
    local_228._4_4_ = fVar246;
    local_228._0_4_ = fVar245;
    local_228._8_4_ = fVar248;
    local_228._12_4_ = 0;
    fVar165 = fVar210 + (fVar165 - fVar253) * 3.0 * fVar57;
    fVar238 = fVar219 + fVar176;
    fVar241 = fVar225 + fVar177;
    fVar244 = fVar227 + fVar209;
    local_218 = fVar243 + (fVar229 - fVar247) * 3.0 * fVar57;
    fStack_214 = fVar245 + fVar255;
    fStack_210 = fVar246 + fVar257;
    fStack_20c = fVar248 + fVar228;
    local_248._0_4_ = fVar219 - fVar176;
    local_248._4_4_ = fVar225 - fVar177;
    local_248._8_4_ = fVar227 - fVar209;
    local_248._12_4_ = 0;
    local_238._0_4_ = fVar245 - fVar255;
    local_238._4_4_ = fVar246 - fVar257;
    local_238._8_4_ = fVar248 - fVar228;
    local_238._12_4_ = 0;
    local_1f8._8_4_ = fStack_39c;
    local_1f8._12_4_ = 0;
    fVar247 = (fVar219 - fStack_3a4) + (fVar210 - local_3a8);
    fVar253 = (fVar225 - fStack_3a0) + (fVar219 - fStack_3a4);
    fVar255 = (fVar227 - fStack_39c) + (fVar225 - fStack_3a0);
    fVar257 = (fVar227 - fStack_39c) + 0.0;
    fVar57 = (fVar245 - fStack_394) + (fVar243 - local_398);
    fVar176 = (fVar246 - fStack_390) + (fVar245 - fStack_394);
    fVar177 = (fVar248 - fStack_38c) + (fVar246 - fStack_390);
    fVar209 = (fVar248 - fStack_38c) + 0.0;
    auVar157._0_8_ =
         CONCAT44(fStack_394 * fVar253 - fStack_3a4 * fVar176,
                  local_398 * fVar247 - local_3a8 * fVar57);
    auVar157._8_4_ = fStack_390 * fVar255 - fStack_3a0 * fVar177;
    auVar157._12_4_ = fStack_38c * fVar257 - fStack_39c * fVar209;
    auVar118._0_4_ = fVar58 * fVar247 - fVar211 * fVar57;
    auVar118._4_4_ = fVar90 * fVar253 - fVar218 * fVar176;
    auVar118._8_4_ = fStack_520 * fVar255 - fVar220 * fVar177;
    auVar118._12_4_ = fStack_51c * fVar257 - fVar226 * fVar209;
    auVar130._0_8_ =
         CONCAT44(local_1e8._4_4_ * fVar253 - fVar176 * fVar91,
                  local_1e8._0_4_ * fVar247 - fVar57 * fVar89);
    auVar130._8_4_ = local_1e8._8_4_ * fVar255 - fVar177 * fVar148;
    auVar130._12_4_ = fVar257 * 0.0 - fVar209 * 0.0;
    auVar271._0_4_ = fVar247 * fStack_394 - fVar57 * fStack_3a4;
    auVar271._4_4_ = fVar253 * fStack_390 - fVar176 * fStack_3a0;
    auVar271._8_4_ = fVar255 * fStack_38c - fVar177 * fStack_39c;
    auVar271._12_4_ = fVar257 * 0.0 - fVar209 * 0.0;
    auVar82._0_8_ =
         CONCAT44(fVar245 * fVar253 - fVar219 * fVar176,fVar243 * fVar247 - fVar210 * fVar57);
    auVar82._8_4_ = fVar246 * fVar255 - fVar225 * fVar177;
    auVar82._12_4_ = fVar248 * fVar257 - fVar227 * fVar209;
    auVar235._0_4_ = local_218 * fVar247 - fVar165 * fVar57;
    auVar235._4_4_ = fStack_214 * fVar253 - fVar238 * fVar176;
    auVar235._8_4_ = fStack_210 * fVar255 - fVar241 * fVar177;
    auVar235._12_4_ = fStack_20c * fVar257 - fVar244 * fVar209;
    auVar200._0_8_ =
         CONCAT44(local_238._4_4_ * fVar253 - fVar176 * local_248._4_4_,
                  local_238._0_4_ * fVar247 - fVar57 * local_248._0_4_);
    auVar200._8_4_ = local_238._8_4_ * fVar255 - fVar177 * local_248._8_4_;
    auVar200._12_4_ = fVar257 * 0.0 - fVar209 * 0.0;
    auVar221._0_4_ = fVar247 * fVar245 - fVar57 * fVar219;
    auVar221._4_4_ = fVar253 * fVar246 - fVar176 * fVar225;
    auVar221._8_4_ = fVar255 * fVar248 - fVar177 * fVar227;
    auVar221._12_4_ = fVar257 * 0.0 - fVar209 * 0.0;
    auVar266._8_4_ = auVar157._8_4_;
    auVar266._0_8_ = auVar157._0_8_;
    auVar266._12_4_ = auVar157._12_4_;
    auVar156 = minps(auVar266,auVar118);
    auVar155 = maxps(auVar157,auVar118);
    auVar119._8_4_ = auVar130._8_4_;
    auVar119._0_8_ = auVar130._0_8_;
    auVar119._12_4_ = auVar130._12_4_;
    auVar66 = minps(auVar119,auVar271);
    auVar267 = minps(auVar156,auVar66);
    auVar66 = maxps(auVar130,auVar271);
    auVar113 = maxps(auVar155,auVar66);
    auVar120._8_4_ = auVar82._8_4_;
    auVar120._0_8_ = auVar82._0_8_;
    auVar120._12_4_ = auVar82._12_4_;
    auVar155 = minps(auVar120,auVar235);
    auVar66 = maxps(auVar82,auVar235);
    auVar131._8_4_ = auVar200._8_4_;
    auVar131._0_8_ = auVar200._0_8_;
    auVar131._12_4_ = auVar200._12_4_;
    auVar156 = minps(auVar131,auVar221);
    auVar155 = minps(auVar155,auVar156);
    auVar156 = minps(auVar267,auVar155);
    auVar155 = maxps(auVar200,auVar221);
    auVar66 = maxps(auVar66,auVar155);
    auVar66 = maxps(auVar113,auVar66);
    auVar158._0_4_ =
         -(uint)(local_268 <= auVar66._0_4_ && auVar156._0_4_ <= local_258) & local_278._0_4_;
    auVar158._4_4_ =
         -(uint)(fStack_264 <= auVar66._4_4_ && auVar156._4_4_ <= fStack_254) & local_278._4_4_;
    auVar158._8_4_ =
         -(uint)(fStack_260 <= auVar66._8_4_ && auVar156._8_4_ <= fStack_250) & local_278._8_4_;
    auVar158._12_4_ =
         -(uint)(fStack_25c <= auVar66._12_4_ && auVar156._12_4_ <= fStack_24c) & local_278._12_4_;
    iVar45 = movmskps((int)pRVar48,auVar158);
    uVar41 = 0;
    if (iVar45 != 0) {
      fVar247 = (fVar219 - fVar210) + (fStack_3a4 - local_3a8);
      fVar253 = (fVar225 - fVar219) + (fStack_3a0 - fStack_3a4);
      fVar255 = (fVar227 - fVar225) + (fStack_39c - fStack_3a0);
      fVar257 = (0.0 - fVar227) + (0.0 - fStack_39c);
      fVar57 = (fVar245 - fVar243) + (fStack_394 - local_398);
      fVar176 = (fVar246 - fVar245) + (fStack_390 - fStack_394);
      fVar177 = (fVar248 - fVar246) + (fStack_38c - fStack_390);
      fVar209 = (0.0 - fVar248) + (0.0 - fStack_38c);
      auVar272._0_8_ =
           CONCAT44(fStack_394 * fVar253 - fStack_3a4 * fVar176,
                    local_398 * fVar247 - local_3a8 * fVar57);
      auVar272._8_4_ = fStack_390 * fVar255 - fStack_3a0 * fVar177;
      auVar272._12_4_ = fStack_38c * fVar257 - fStack_39c * fVar209;
      auVar121._0_4_ = fVar58 * fVar247 - fVar211 * fVar57;
      auVar121._4_4_ = fVar90 * fVar253 - fVar218 * fVar176;
      auVar121._8_4_ = fStack_520 * fVar255 - fVar220 * fVar177;
      auVar121._12_4_ = fStack_51c * fVar257 - fVar226 * fVar209;
      auVar193._0_8_ =
           CONCAT44(local_1e8._4_4_ * fVar253 - fVar91 * fVar176,
                    local_1e8._0_4_ * fVar247 - fVar89 * fVar57);
      auVar193._8_4_ = local_1e8._8_4_ * fVar255 - fVar148 * fVar177;
      auVar193._12_4_ = fVar257 * 0.0 - fVar209 * 0.0;
      auVar132._0_4_ = fStack_394 * fVar247 - fStack_3a4 * fVar57;
      auVar132._4_4_ = fStack_390 * fVar253 - fStack_3a0 * fVar176;
      auVar132._8_4_ = fStack_38c * fVar255 - fStack_39c * fVar177;
      auVar132._12_4_ = fVar257 * 0.0 - fVar209 * 0.0;
      auVar260._0_8_ =
           CONCAT44(fVar245 * fVar253 - fVar219 * fVar176,fVar243 * fVar247 - fVar210 * fVar57);
      auVar260._8_4_ = fVar246 * fVar255 - fVar225 * fVar177;
      auVar260._12_4_ = fVar248 * fVar257 - fVar227 * fVar209;
      auVar145._0_4_ = local_218 * fVar247 - fVar165 * fVar57;
      auVar145._4_4_ = fStack_214 * fVar253 - fVar238 * fVar176;
      auVar145._8_4_ = fStack_210 * fVar255 - fVar241 * fVar177;
      auVar145._12_4_ = fStack_20c * fVar257 - fVar244 * fVar209;
      auVar236._0_8_ =
           CONCAT44(local_238._4_4_ * fVar253 - local_248._4_4_ * fVar176,
                    local_238._0_4_ * fVar247 - local_248._0_4_ * fVar57);
      auVar236._8_4_ = local_238._8_4_ * fVar255 - local_248._8_4_ * fVar177;
      auVar236._12_4_ = fVar257 * 0.0 - fVar209 * 0.0;
      auVar222._0_4_ = fVar247 * fVar245 - fVar57 * fVar219;
      auVar222._4_4_ = fVar253 * fVar246 - fVar176 * fVar225;
      auVar222._8_4_ = fVar255 * fVar248 - fVar177 * fVar227;
      auVar222._12_4_ = fVar257 * 0.0 - fVar209 * 0.0;
      auVar83._8_4_ = auVar272._8_4_;
      auVar83._0_8_ = auVar272._0_8_;
      auVar83._12_4_ = auVar272._12_4_;
      auVar66 = minps(auVar83,auVar121);
      auVar156 = maxps(auVar272,auVar121);
      auVar122._8_4_ = auVar193._8_4_;
      auVar122._0_8_ = auVar193._0_8_;
      auVar122._12_4_ = auVar193._12_4_;
      auVar155 = minps(auVar122,auVar132);
      auVar66 = minps(auVar66,auVar155);
      auVar155 = maxps(auVar193,auVar132);
      auVar267 = maxps(auVar156,auVar155);
      auVar123._8_4_ = auVar260._8_4_;
      auVar123._0_8_ = auVar260._0_8_;
      auVar123._12_4_ = auVar260._12_4_;
      auVar155 = minps(auVar123,auVar145);
      auVar113 = maxps(auVar260,auVar145);
      auVar133._8_4_ = auVar236._8_4_;
      auVar133._0_8_ = auVar236._0_8_;
      auVar133._12_4_ = auVar236._12_4_;
      auVar156 = minps(auVar133,auVar222);
      auVar155 = minps(auVar155,auVar156);
      auVar66 = minps(auVar66,auVar155);
      auVar155 = maxps(auVar236,auVar222);
      auVar155 = maxps(auVar113,auVar155);
      auVar155 = maxps(auVar267,auVar155);
      auVar273._0_4_ =
           -(uint)(local_268 <= auVar155._0_4_ && auVar66._0_4_ <= local_258) & auVar158._0_4_;
      auVar273._4_4_ =
           -(uint)(fStack_264 <= auVar155._4_4_ && auVar66._4_4_ <= fStack_254) & auVar158._4_4_;
      auVar273._8_4_ =
           -(uint)(fStack_260 <= auVar155._8_4_ && auVar66._8_4_ <= fStack_250) & auVar158._8_4_;
      auVar273._12_4_ =
           -(uint)(fStack_25c <= auVar155._12_4_ && auVar66._12_4_ <= fStack_24c) & auVar158._12_4_;
      uVar55 = movmskps(0,auVar273);
      uVar41 = (ulong)uVar55;
    }
    if ((uint)uVar41 != 0) {
      uVar42 = (ulong)uVar54;
      auStack_308[uVar42] = (uint)uVar41;
      *(undefined8 *)(afStack_108 + uVar42 * 2) = local_4e8;
      auStack_58[uVar42] = (ulong)local_538;
      uVar54 = uVar54 + 1;
    }
    do {
      if (uVar54 == 0) {
        fVar127 = *(float *)(ray + k * 4 + 0x80);
        auVar106._4_4_ = -(uint)(fStack_2d4 <= fVar127);
        auVar106._0_4_ = -(uint)(local_2d8 <= fVar127);
        auVar106._8_4_ = -(uint)(fStack_2d0 <= fVar127);
        auVar106._12_4_ = -(uint)(fStack_2cc <= fVar127);
        uVar52 = movmskps((int)uVar41,auVar106);
        uVar51 = uVar51 & (uint)local_430 & uVar52;
        if (uVar51 == 0) {
          return;
        }
        goto LAB_00b50553;
      }
      uVar55 = uVar54 - 1;
      uVar42 = (ulong)uVar55;
      uVar49 = auStack_308[uVar42];
      local_538 = (undefined1  [8])auStack_58[uVar42];
      uVar41 = 0;
      if (uVar49 != 0) {
        for (; (uVar49 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
        }
      }
      uVar49 = uVar49 - 1 & uVar49;
      auStack_308[uVar42] = uVar49;
      if (uVar49 == 0) {
        uVar54 = uVar55;
      }
      pRVar47 = (RTCIntersectArguments *)(uVar41 + 1);
      pRVar48 = pRVar47;
      if ((long)pRVar47 < 0) {
        pRVar48 = (RTCIntersectArguments *)((ulong)((uint)pRVar47 & 1) | (ulong)pRVar47 >> 1);
      }
      fVar57 = afStack_108[uVar42 * 2];
      fVar58 = afStack_108[uVar42 * 2 + 1];
      fVar89 = fVar57 * (1.0 - (float)uVar41 * 0.33333334) + fVar58 * (float)uVar41 * 0.33333334;
      fVar90 = fVar57 * (1.0 - (float)pRVar47 * 0.33333334) + fVar58 * (float)pRVar47 * 0.33333334;
      fVar91 = fVar57 * 0.0 + fVar58 * 0.0;
      fVar58 = fVar57 * 0.0 + fVar58 * 0.0;
      fVar57 = fVar90 - fVar89;
      _fStack_530 = 0;
      local_4e8 = CONCAT44(fVar90,fVar89);
      if (0.16666667 <= fVar57) break;
      fVar241 = SUB84(local_538,0);
      fVar247 = (float)((ulong)local_538 >> 0x20);
      fVar148 = 1.0 - fVar241;
      fVar165 = 1.0 - fVar241;
      fVar176 = 1.0 - fVar247;
      fVar177 = 1.0 - fVar247;
      fVar219 = fVar107 * fVar148 + local_348 * fVar241;
      fVar225 = fVar126 * fVar165 + fStack_344 * fVar241;
      fVar227 = fVar107 * fVar176 + fStack_340 * fVar247;
      fVar238 = fVar126 * fVar177 + fStack_33c * fVar247;
      fVar228 = (float)local_318 * fVar148 + (float)local_358 * fVar241;
      fVar229 = local_318._4_4_ * fVar165 + local_358._4_4_ * fVar241;
      fVar239 = (float)uStack_310 * fVar176 + (float)uStack_350 * fVar247;
      fVar240 = uStack_310._4_4_ * fVar177 + uStack_350._4_4_ * fVar247;
      fVar242 = (float)local_328 * fVar148 + local_368 * fVar241;
      fVar245 = local_328._4_4_ * fVar165 + fStack_364 * fVar241;
      fVar248 = (float)uStack_320 * fVar176 + fStack_360 * fVar247;
      fVar256 = uStack_320._4_4_ * fVar177 + fStack_35c * fVar247;
      fVar244 = (fVar148 * (float)local_338 + fVar241 * (float)local_378) - fVar242;
      fVar253 = (fVar165 * local_338._4_4_ + fVar241 * local_378._4_4_) - fVar245;
      fVar255 = (fVar176 * (float)uStack_330 + fVar247 * (float)uStack_370) - fVar248;
      fVar257 = (fVar177 * uStack_330._4_4_ + fVar247 * uStack_370._4_4_) - fVar256;
      fVar148 = fVar89 * (fVar242 - fVar228) + fVar228;
      fVar165 = fVar89 * (fVar245 - fVar229) + fVar229;
      fVar176 = fVar89 * (fVar248 - fVar239) + fVar239;
      fVar177 = fVar89 * (fVar256 - fVar240) + fVar240;
      fVar243 = (fVar242 - fVar228) * fVar90 + fVar228;
      fVar246 = (fVar245 - fVar229) * fVar90 + fVar229;
      fVar254 = (fVar248 - fVar239) * fVar90 + fVar239;
      fVar258 = (fVar256 - fVar240) * fVar90 + fVar240;
      fVar209 = fVar89 * (fVar228 - fVar219) + fVar219;
      fVar210 = fVar89 * (fVar229 - fVar225) + fVar225;
      fVar211 = fVar89 * (fVar239 - fVar227) + fVar227;
      fVar218 = fVar89 * (fVar240 - fVar238) + fVar238;
      fVar209 = (fVar148 - fVar209) * fVar89 + fVar209;
      fVar210 = (fVar165 - fVar210) * fVar89 + fVar210;
      fVar211 = (fVar176 - fVar211) * fVar89 + fVar211;
      fVar218 = (fVar177 - fVar218) * fVar89 + fVar218;
      fVar148 = (((fVar89 * fVar244 + fVar242) - fVar148) * fVar89 + fVar148) - fVar209;
      fVar165 = (((fVar89 * fVar253 + fVar245) - fVar165) * fVar89 + fVar165) - fVar210;
      fVar176 = (((fVar89 * fVar255 + fVar248) - fVar176) * fVar89 + fVar176) - fVar211;
      fVar177 = (((fVar89 * fVar257 + fVar256) - fVar177) * fVar89 + fVar177) - fVar218;
      fVar209 = fVar89 * fVar148 + fVar209;
      fVar210 = fVar89 * fVar165 + fVar210;
      fVar211 = fVar89 * fVar176 + fVar211;
      fVar218 = fVar89 * fVar177 + fVar218;
      fVar219 = (fVar228 - fVar219) * fVar90 + fVar219;
      fVar225 = (fVar229 - fVar225) * fVar90 + fVar225;
      fVar227 = (fVar239 - fVar227) * fVar90 + fVar227;
      fVar238 = (fVar240 - fVar238) * fVar90 + fVar238;
      fVar219 = (fVar243 - fVar219) * fVar90 + fVar219;
      fVar225 = (fVar246 - fVar225) * fVar90 + fVar225;
      fVar227 = (fVar254 - fVar227) * fVar90 + fVar227;
      fVar238 = (fVar258 - fVar238) * fVar90 + fVar238;
      fVar228 = (((fVar244 * fVar90 + fVar242) - fVar243) * fVar90 + fVar243) - fVar219;
      fVar229 = (((fVar253 * fVar90 + fVar245) - fVar246) * fVar90 + fVar246) - fVar225;
      fVar239 = (((fVar255 * fVar90 + fVar248) - fVar254) * fVar90 + fVar254) - fVar227;
      fVar240 = (((fVar257 * fVar90 + fVar256) - fVar258) * fVar90 + fVar258) - fVar238;
      fVar219 = fVar90 * fVar228 + fVar219;
      fVar225 = fVar90 * fVar229 + fVar225;
      fVar227 = fVar90 * fVar239 + fVar227;
      fVar238 = fVar90 * fVar240 + fVar238;
      fVar242 = fVar57 * 0.33333334;
      fVar244 = fVar148 * 3.0 * fVar242 + fVar209;
      fVar253 = fVar165 * 3.0 * fVar242 + fVar210;
      fVar255 = fVar176 * 3.0 * fVar242 + fVar211;
      fVar257 = fVar177 * 3.0 * fVar242 + fVar218;
      fVar228 = fVar219 - fVar242 * fVar228 * 3.0;
      fVar229 = fVar225 - fVar242 * fVar229 * 3.0;
      fVar239 = fVar227 - fVar242 * fVar239 * 3.0;
      fVar240 = fVar238 - fVar242 * fVar240 * 3.0;
      fVar246 = (fVar227 - fVar219) + (fVar211 - fVar209);
      fVar248 = (fVar238 - fVar225) + (fVar218 - fVar210);
      auVar201._0_4_ = fVar248 * fVar225;
      auVar201._4_4_ = fVar248 * fVar225;
      auVar201._8_4_ = fVar248 * fVar238;
      auVar201._12_4_ = fVar248 * fVar238;
      fVar148 = fVar209 * fVar246 + fVar210 * fVar248;
      fVar165 = fVar211 * fVar246 + fVar218 * fVar248;
      fVar254 = fVar244 * fVar246 + fVar253 * fVar248;
      fVar256 = fVar255 * fVar246 + fVar257 * fVar248;
      fVar242 = fVar228 * fVar246 + fVar229 * fVar248;
      auVar212._4_4_ = fVar229 * fVar246 + fVar229 * fVar248;
      auVar212._0_4_ = fVar242;
      fVar243 = fVar239 * fVar246 + fVar240 * fVar248;
      fVar176 = fVar246 * fVar219 + auVar201._0_4_;
      fVar245 = fVar246 * fVar227 + auVar201._8_4_;
      auVar13._4_8_ = auVar201._8_8_;
      auVar13._0_4_ = fVar253 * fVar246 + fVar253 * fVar248;
      auVar202._0_8_ = auVar13._0_8_ << 0x20;
      auVar202._8_4_ = fVar256;
      auVar202._12_4_ = fVar257 * fVar246 + fVar257 * fVar248;
      fVar177 = fVar254;
      if (fVar254 <= fVar148) {
        fVar177 = fVar148;
        fVar148 = fVar254;
      }
      auVar203._8_8_ = auVar202._8_8_;
      auVar203._0_8_ = auVar203._8_8_;
      auVar212._8_4_ = fVar243;
      auVar212._12_4_ = fVar240 * fVar246 + fVar240 * fVar248;
      if (fVar176 <= fVar242) {
        auVar212._0_4_ = fVar176;
      }
      if (auVar212._0_4_ <= fVar148) {
        fVar148 = auVar212._0_4_;
      }
      auVar14._4_8_ = auVar212._8_8_;
      auVar14._0_4_ = fVar246 * fVar225 + auVar201._4_4_;
      auVar213._0_8_ = auVar14._0_8_ << 0x20;
      auVar213._8_4_ = fVar245;
      auVar213._12_4_ = fVar246 * fVar238 + auVar201._12_4_;
      if (fVar176 <= fVar242) {
        fVar176 = fVar242;
      }
      auVar214._8_8_ = auVar213._8_8_;
      auVar214._0_8_ = auVar214._8_8_;
      if (fVar176 <= fVar177) {
        fVar176 = fVar177;
      }
      if (fVar256 <= fVar165) {
        auVar203._0_4_ = fVar165;
        fVar165 = fVar256;
      }
      fVar177 = fVar243;
      if (fVar245 <= fVar243) {
        fVar177 = fVar245;
      }
      if (fVar177 <= fVar165) {
        fVar165 = fVar177;
      }
      if (fVar245 <= fVar243) {
        auVar214._0_4_ = fVar243;
      }
      if (auVar214._0_4_ <= auVar203._0_4_) {
        auVar214._0_4_ = auVar203._0_4_;
      }
      uVar15 = (undefined3)(uVar55 >> 8);
      uVar41 = (ulong)CONCAT31(uVar15,3 < uVar54);
      fVar177 = auVar214._0_4_;
      if ((0.0001 <= fVar148) || (fVar177 <= -0.0001)) {
        if ((-0.0001 < fVar176 && fVar165 < 0.0001) ||
           ((fVar148 < 0.0001 && -0.0001 < fVar176 || (fVar165 < 0.0001 && -0.0001 < fVar177))))
        goto LAB_00b517d5;
        bVar18 = true;
        pRVar48 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar48 >> 8),fVar57 < 0.001);
      }
      else {
LAB_00b517d5:
        local_508 = (LinearSpace3fa *)CONCAT44(fVar238,fVar227);
        bVar38 = 3 < uVar54 || fVar57 < 0.001;
        uVar41 = (ulong)CONCAT31(uVar15,bVar38);
        fVar245 = (float)(~-(uint)(fVar148 < 0.0) & 0x3f800000 | -(uint)(fVar148 < 0.0) & 0xbf800000
                         );
        fVar243 = (float)(~-(uint)(fVar176 < 0.0) & 0x3f800000 | -(uint)(fVar176 < 0.0) & 0xbf800000
                         );
        fVar242 = 0.0;
        if ((fVar245 == fVar243) && (!NAN(fVar245) && !NAN(fVar243))) {
          fVar242 = INFINITY;
        }
        fVar246 = 0.0;
        if ((fVar245 == fVar243) && (!NAN(fVar245) && !NAN(fVar243))) {
          fVar246 = -INFINITY;
        }
        fVar248 = (float)(~-(uint)(fVar165 < 0.0) & 0x3f800000 | -(uint)(fVar165 < 0.0) & 0xbf800000
                         );
        if ((fVar245 != fVar248) || (fVar254 = fVar246, NAN(fVar245) || NAN(fVar248))) {
          if ((fVar165 != fVar148) || (NAN(fVar165) || NAN(fVar148))) {
            fVar254 = -fVar148 / (fVar165 - fVar148);
            fVar254 = (1.0 - fVar254) * 0.0 + fVar254;
            fVar165 = fVar254;
          }
          else {
            fVar165 = INFINITY;
            if ((fVar148 == 0.0) && (fVar165 = INFINITY, !NAN(fVar148))) {
              fVar165 = 0.0;
            }
            fVar254 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar148 == 0.0) & 1) * 4);
          }
          if (fVar165 <= fVar242) {
            fVar242 = fVar165;
          }
          if (fVar254 <= fVar246) {
            fVar254 = fVar246;
          }
        }
        pRVar48 = (RTCIntersectArguments *)(ulong)(fVar177 < 0.0);
        fVar148 = *(float *)(&DAT_01ff1ecc + (long)pRVar48 * 4);
        if ((fVar243 != fVar148) || (fVar165 = fVar254, NAN(fVar243) || NAN(fVar148))) {
          if ((fVar177 != fVar176) || (NAN(fVar177) || NAN(fVar176))) {
            fVar177 = -fVar176 / (fVar177 - fVar176);
            fVar177 = (1.0 - fVar177) * 0.0 + fVar177;
            fVar165 = fVar177;
          }
          else {
            fVar177 = INFINITY;
            if ((fVar176 == 0.0) && (fVar177 = INFINITY, !NAN(fVar176))) {
              fVar177 = 0.0;
            }
            pRVar48 = (RTCIntersectArguments *)(ulong)(-(uint)(fVar176 == 0.0) & 1);
            fVar165 = *(float *)(&DAT_01ff1ec4 + (long)pRVar48 * 4);
          }
          if (fVar177 <= fVar242) {
            fVar242 = fVar177;
          }
          if (fVar165 <= fVar254) {
            fVar165 = fVar254;
          }
        }
        if ((fVar248 != fVar148) || (NAN(fVar248) || NAN(fVar148))) {
          fVar242 = (float)(~-(uint)(fVar242 < 1.0) & 0x3f800000 |
                           (uint)fVar242 & -(uint)(fVar242 < 1.0));
          fVar165 = (float)(~-(uint)(fVar165 < 1.0) & (uint)fVar165 |
                           -(uint)(fVar165 < 1.0) & 0x3f800000);
        }
        fVar242 = (float)(~-(uint)(fVar242 < 0.0) & (uint)fVar242);
        fVar148 = (float)(~-(uint)(fVar165 < 1.0) & 0x3f800000 |
                         (uint)fVar165 & -(uint)(fVar165 < 1.0));
        bVar18 = true;
        if (fVar242 <= fVar148) {
          fVar242 = fVar242 + -0.1;
          fVar148 = fVar148 + 0.1;
          uVar55 = -(uint)(fVar148 < 1.0);
          fVar242 = (float)(~-(uint)(fVar242 < 0.0) & (uint)fVar242);
          fVar254 = (float)(~uVar55 & 0x3f800000 | (uint)fVar148 & uVar55);
          fVar243 = 1.0 - fVar242;
          fVar245 = 1.0 - fVar242;
          fVar246 = 1.0 - fVar254;
          fVar248 = 1.0 - fVar254;
          fVar148 = fVar209 * fVar243 + fVar211 * fVar242;
          fVar165 = fVar210 * fVar245 + fVar218 * fVar242;
          fVar176 = fVar209 * fVar246 + fStack_520 * fVar254;
          fVar177 = fVar210 * fVar248 + fStack_51c * fVar254;
          fVar209 = fVar244 * fVar243 + fVar255 * fVar242;
          fVar210 = fVar253 * fVar245 + fVar257 * fVar242;
          fVar211 = fVar244 * fVar246 + fVar255 * fVar254;
          fVar218 = fVar253 * fVar248 + fVar257 * fVar254;
          fVar244 = fVar228 * fVar243 + fVar239 * fVar242;
          fVar253 = fVar229 * fVar245 + fVar240 * fVar242;
          fVar255 = fVar228 * fVar246 + fVar239 * fVar254;
          fVar257 = fVar229 * fVar248 + fVar240 * fVar254;
          fVar227 = fVar243 * fVar219 + fVar227 * fVar242;
          fVar238 = fVar245 * fVar225 + fVar238 * fVar242;
          fVar219 = fVar246 * fVar219 + fVar220 * fVar254;
          fVar225 = fVar248 * fVar225 + fVar226 * fVar254;
          local_538._0_4_ = fVar241 * (1.0 - fVar242) + fVar247 * fVar242;
          fStack_51c = fVar241 * (1.0 - fVar254) + fVar247 * fVar254;
          fVar57 = 1.0 / fVar57;
          auVar103._0_4_ = fVar219 - fVar227;
          auVar103._4_4_ = fVar225 - fVar238;
          auVar103._8_4_ = fVar219 - fVar219;
          auVar103._12_4_ = fVar225 - fVar225;
          auVar134._0_8_ = CONCAT44(fVar257 - fVar253,fVar255 - fVar244);
          auVar134._8_4_ = fVar255 - fVar255;
          auVar134._12_4_ = fVar257 - fVar257;
          auVar223._0_4_ = fVar211 - fVar209;
          auVar223._4_4_ = fVar218 - fVar210;
          auVar223._8_4_ = fVar211 - fVar211;
          auVar223._12_4_ = fVar218 - fVar218;
          auVar194._0_8_ = CONCAT44((fVar210 - fVar165) * 3.0,(fVar209 - fVar148) * 3.0);
          auVar194._8_4_ = (fVar211 - fVar176) * 3.0;
          auVar194._12_4_ = (fVar218 - fVar177) * 3.0;
          auVar159._0_8_ = CONCAT44((fVar253 - fVar210) * 3.0,(fVar244 - fVar209) * 3.0);
          auVar159._8_4_ = (fVar255 - fVar211) * 3.0;
          auVar159._12_4_ = (fVar257 - fVar218) * 3.0;
          auVar215._0_4_ = (fVar227 - fVar244) * 3.0;
          auVar215._4_4_ = (fVar238 - fVar253) * 3.0;
          auVar215._8_4_ = (fVar219 - fVar255) * 3.0;
          auVar215._12_4_ = (fVar225 - fVar257) * 3.0;
          auVar168._8_4_ = auVar159._8_4_;
          auVar168._0_8_ = auVar159._0_8_;
          auVar168._12_4_ = auVar159._12_4_;
          auVar155 = minps(auVar168,auVar215);
          auVar66 = maxps(auVar159,auVar215);
          auVar204._8_4_ = auVar194._8_4_;
          auVar204._0_8_ = auVar194._0_8_;
          auVar204._12_4_ = auVar194._12_4_;
          auVar113 = minps(auVar204,auVar155);
          auVar156 = maxps(auVar194,auVar66);
          auVar16._4_8_ = auVar66._8_8_;
          auVar16._0_4_ = auVar113._4_4_;
          auVar160._0_8_ = auVar16._0_8_ << 0x20;
          auVar160._8_4_ = auVar113._8_4_;
          auVar160._12_4_ = auVar113._12_4_;
          auVar161._8_8_ = auVar113._8_8_;
          auVar161._0_8_ = auVar160._8_8_;
          auVar17._4_8_ = auVar155._8_8_;
          auVar17._0_4_ = auVar156._4_4_;
          auVar169._0_8_ = auVar17._0_8_ << 0x20;
          auVar169._8_4_ = auVar156._8_4_;
          auVar169._12_4_ = auVar156._12_4_;
          auVar170._8_8_ = auVar156._8_8_;
          auVar170._0_8_ = auVar169._8_8_;
          auVar155 = minps(auVar113,auVar161);
          auVar66 = maxps(auVar156,auVar170);
          fVar240 = auVar155._0_4_ * fVar57;
          fVar242 = auVar155._4_4_ * fVar57;
          fVar243 = auVar155._8_4_ * fVar57;
          fVar245 = auVar155._12_4_ * fVar57;
          fVar238 = fVar57 * auVar66._0_4_;
          fVar244 = fVar57 * auVar66._4_4_;
          fVar253 = fVar57 * auVar66._8_4_;
          fVar57 = fVar57 * auVar66._12_4_;
          fVar229 = 1.0 / (fStack_51c - (float)local_538._0_4_);
          auVar124._0_8_ = CONCAT44(fVar177 - fVar165,fVar176 - fVar148);
          auVar124._8_4_ = fVar176 - fVar176;
          auVar124._12_4_ = fVar177 - fVar177;
          auVar171._8_4_ = auVar124._8_4_;
          auVar171._0_8_ = auVar124._0_8_;
          auVar171._12_4_ = auVar124._12_4_;
          auVar156 = minps(auVar171,auVar223);
          auVar155 = maxps(auVar124,auVar223);
          auVar84._8_4_ = auVar134._8_4_;
          auVar84._0_8_ = auVar134._0_8_;
          auVar84._12_4_ = auVar134._12_4_;
          auVar66 = minps(auVar84,auVar103);
          auVar156 = minps(auVar156,auVar66);
          auVar66 = maxps(auVar134,auVar103);
          auVar66 = maxps(auVar155,auVar66);
          fVar257 = auVar156._0_4_ * fVar229;
          fVar228 = auVar156._4_4_ * fVar229;
          fVar239 = fVar229 * auVar66._0_4_;
          fVar229 = fVar229 * auVar66._4_4_;
          local_538._4_4_ = fStack_51c;
          fStack_530 = fVar241 * 0.0 + fVar247 * 0.0;
          fStack_52c = fVar241 * 0.0 + fVar247 * 0.0;
          auVar162._4_4_ = fStack_51c;
          auVar162._0_4_ = fVar90;
          auVar162._8_4_ = fVar91;
          auVar162._12_4_ = fVar58;
          local_b8 = (fVar89 + fVar90) * 0.5;
          fVar148 = ((float)local_538._0_4_ + fStack_51c) * 0.5;
          fVar165 = (fVar90 + fVar91) * 0.0;
          fVar176 = (fStack_51c + fVar58) * 0.0;
          fVar177 = local_118 * local_b8 + fVar107;
          fVar209 = fStack_114 * local_b8 + fVar126;
          fVar210 = fStack_110 * local_b8 + fVar140;
          fVar211 = fStack_10c * local_b8 + fVar141;
          fVar218 = local_128 * local_b8 + fVar197;
          fVar219 = fStack_124 * local_b8 + fVar198;
          fVar225 = fStack_120 * local_b8 + fVar164;
          fVar227 = fStack_11c * local_b8 + fVar128;
          fVar177 = (fVar218 - fVar177) * local_b8 + fVar177;
          fVar209 = (fVar219 - fVar209) * local_b8 + fVar209;
          fVar210 = (fVar225 - fVar210) * local_b8 + fVar210;
          fVar211 = (fVar227 - fVar211) * local_b8 + fVar211;
          fVar218 = (((local_138 * local_b8 + fVar178) - fVar218) * local_b8 + fVar218) - fVar177;
          fVar219 = (((fStack_134 * local_b8 + fVar196) - fVar219) * local_b8 + fVar219) - fVar209;
          fVar225 = (((fStack_130 * local_b8 + fVar149) - fVar225) * local_b8 + fVar225) - fVar210;
          fVar227 = (((fStack_12c * local_b8 + fVar163) - fVar227) * local_b8 + fVar227) - fVar211;
          fVar177 = local_b8 * fVar218 + fVar177;
          fVar209 = local_b8 * fVar219 + fVar209;
          fVar218 = fVar218 * 3.0;
          fVar219 = fVar219 * 3.0;
          fVar210 = (local_b8 * fVar225 + fVar210) - fVar177;
          fVar211 = (local_b8 * fVar227 + fVar211) - fVar209;
          fVar218 = (fVar225 * 3.0 - fVar218) * fVar148 + fVar218;
          fVar219 = (fVar227 * 3.0 - fVar219) * fVar148 + fVar219;
          auVar104._0_8_ = CONCAT44(fVar218,fVar210) ^ 0x80000000;
          auVar104._8_4_ = fVar218;
          auVar104._12_4_ = fVar218;
          fVar246 = fVar89 - local_b8;
          fVar248 = (float)local_538._0_4_ - fVar148;
          fVar254 = fVar90 - fVar165;
          fVar256 = fStack_51c - fVar176;
          fVar258 = fVar90 - local_b8;
          fVar259 = fStack_51c - fVar148;
          fVar91 = fVar91 - fVar165;
          fVar58 = fVar58 - fVar176;
          fVar177 = fVar210 * fVar148 + fVar177;
          fVar209 = fVar211 * fVar148 + fVar209;
          auVar125._0_8_ = CONCAT44(fVar219,fVar211) ^ 0x8000000000000000;
          auVar125._8_4_ = -fVar219;
          auVar125._12_4_ = -fVar219;
          auVar250._0_4_ = fVar211 * fVar218 - fVar219 * fVar210;
          auVar250._4_4_ = auVar250._0_4_;
          auVar250._8_4_ = auVar250._0_4_;
          auVar250._12_4_ = auVar250._0_4_;
          auVar155 = divps(auVar125,auVar250);
          auVar66 = divps(auVar104,auVar250);
          fVar211 = auVar155._0_4_;
          fVar218 = auVar155._4_4_;
          fVar176 = auVar66._0_4_;
          fVar210 = auVar66._4_4_;
          local_b8 = local_b8 - (fVar209 * fVar176 + fVar177 * fVar211);
          local_a8 = fVar148 - (fVar209 * fVar210 + fVar177 * fVar218);
          fVar165 = fVar148 - (fVar209 * auVar66._8_4_ + fVar177 * auVar155._8_4_);
          fVar148 = fVar148 - (fVar209 * auVar66._12_4_ + fVar177 * auVar155._12_4_);
          auVar268._0_8_ = CONCAT44(fVar218 * fVar257,fVar218 * fVar240);
          auVar268._8_4_ = fVar218 * fVar242;
          auVar268._12_4_ = fVar218 * fVar228;
          auVar216._0_4_ = fVar218 * fVar238;
          auVar216._4_4_ = fVar218 * fVar239;
          auVar216._8_4_ = fVar218 * fVar244;
          auVar216._12_4_ = fVar218 * fVar229;
          auVar274._8_4_ = auVar268._8_4_;
          auVar274._0_8_ = auVar268._0_8_;
          auVar274._12_4_ = auVar268._12_4_;
          auVar113 = minps(auVar274,auVar216);
          auVar155 = maxps(auVar216,auVar268);
          auVar135._0_8_ = CONCAT44(fVar210 * fVar228,fVar210 * fVar242);
          auVar135._8_4_ = fVar210 * fVar243;
          auVar135._12_4_ = fVar210 * fVar245;
          auVar269._0_4_ = fVar210 * fVar244;
          auVar269._4_4_ = fVar210 * fVar229;
          auVar269._8_4_ = fVar210 * fVar253;
          auVar269._12_4_ = fVar210 * fVar57;
          auVar205._8_4_ = auVar135._8_4_;
          auVar205._0_8_ = auVar135._0_8_;
          auVar205._12_4_ = auVar135._12_4_;
          auVar66 = minps(auVar205,auVar269);
          auVar156 = maxps(auVar269,auVar135);
          fVar177 = 0.0 - (auVar156._0_4_ + auVar155._0_4_);
          fVar209 = 1.0 - (auVar156._4_4_ + auVar155._4_4_);
          fVar219 = 0.0 - (auVar156._8_4_ + auVar155._8_4_);
          fVar225 = 0.0 - (auVar156._12_4_ + auVar155._12_4_);
          fVar227 = 0.0 - (auVar66._0_4_ + auVar113._0_4_);
          fVar241 = 1.0 - (auVar66._4_4_ + auVar113._4_4_);
          fVar247 = 0.0 - (auVar66._8_4_ + auVar113._8_4_);
          fVar255 = 0.0 - (auVar66._12_4_ + auVar113._12_4_);
          auVar217._0_8_ = CONCAT44(fVar248 * fVar209,fVar246 * fVar177);
          auVar217._8_4_ = fVar254 * fVar219;
          auVar217._12_4_ = fVar256 * fVar225;
          auVar251._0_8_ = CONCAT44(fVar257 * fVar211,fVar240 * fVar211);
          auVar251._8_4_ = fVar242 * fVar211;
          auVar251._12_4_ = fVar228 * fVar211;
          auVar206._0_4_ = fVar211 * fVar238;
          auVar206._4_4_ = fVar211 * fVar239;
          auVar206._8_4_ = fVar211 * fVar244;
          auVar206._12_4_ = fVar211 * fVar229;
          auVar261._8_4_ = auVar251._8_4_;
          auVar261._0_8_ = auVar251._0_8_;
          auVar261._12_4_ = auVar251._12_4_;
          auVar155 = minps(auVar261,auVar206);
          auVar66 = maxps(auVar206,auVar251);
          auVar172._0_8_ = CONCAT44(fVar228 * fVar176,fVar242 * fVar176);
          auVar172._8_4_ = fVar243 * fVar176;
          auVar172._12_4_ = fVar245 * fVar176;
          auVar270._0_4_ = fVar176 * fVar244;
          auVar270._4_4_ = fVar176 * fVar229;
          auVar270._8_4_ = fVar176 * fVar253;
          auVar270._12_4_ = fVar176 * fVar57;
          auVar275._8_4_ = auVar172._8_4_;
          auVar275._0_8_ = auVar172._0_8_;
          auVar275._12_4_ = auVar172._12_4_;
          auVar113 = minps(auVar275,auVar270);
          auVar252._0_4_ = fVar246 * fVar227;
          auVar252._4_4_ = fVar248 * fVar241;
          auVar252._8_4_ = fVar254 * fVar247;
          auVar252._12_4_ = fVar256 * fVar255;
          auVar136._0_8_ = CONCAT44(fVar209 * fVar259,fVar177 * fVar258);
          auVar136._8_4_ = fVar219 * fVar91;
          auVar136._12_4_ = fVar225 * fVar58;
          auVar146._0_4_ = fVar227 * fVar258;
          auVar146._4_4_ = fVar241 * fVar259;
          auVar146._8_4_ = fVar247 * fVar91;
          auVar146._12_4_ = fVar255 * fVar58;
          auVar156 = maxps(auVar270,auVar172);
          fVar57 = 1.0 - (auVar156._0_4_ + auVar66._0_4_);
          fVar177 = 0.0 - (auVar156._4_4_ + auVar66._4_4_);
          fVar209 = 0.0 - (auVar156._8_4_ + auVar66._8_4_);
          fVar219 = 0.0 - (auVar156._12_4_ + auVar66._12_4_);
          fVar225 = 1.0 - (auVar113._0_4_ + auVar155._0_4_);
          fVar227 = 0.0 - (auVar113._4_4_ + auVar155._4_4_);
          fVar238 = 0.0 - (auVar113._8_4_ + auVar155._8_4_);
          fVar241 = 0.0 - (auVar113._12_4_ + auVar155._12_4_);
          auVar207._0_8_ = CONCAT44(fVar248 * fVar177,fVar246 * fVar57);
          auVar207._8_4_ = fVar254 * fVar209;
          auVar207._12_4_ = fVar256 * fVar219;
          auVar224._0_4_ = fVar246 * fVar225;
          auVar224._4_4_ = fVar248 * fVar227;
          auVar224._8_4_ = fVar254 * fVar238;
          auVar224._12_4_ = fVar256 * fVar241;
          auVar173._0_8_ = CONCAT44(fVar177 * fVar259,fVar57 * fVar258);
          auVar173._8_4_ = fVar209 * fVar91;
          auVar173._12_4_ = fVar219 * fVar58;
          auVar195._0_4_ = fVar225 * fVar258;
          auVar195._4_4_ = fVar227 * fVar259;
          auVar195._8_4_ = fVar238 * fVar91;
          auVar195._12_4_ = fVar241 * fVar58;
          auVar237._8_4_ = auVar207._8_4_;
          auVar237._0_8_ = auVar207._0_8_;
          auVar237._12_4_ = auVar207._12_4_;
          auVar66 = minps(auVar237,auVar224);
          auVar262._8_4_ = auVar173._8_4_;
          auVar262._0_8_ = auVar173._0_8_;
          auVar262._12_4_ = auVar173._12_4_;
          auVar155 = minps(auVar262,auVar195);
          auVar113 = minps(auVar66,auVar155);
          auVar155 = maxps(auVar224,auVar207);
          auVar66 = maxps(auVar195,auVar173);
          auVar156 = maxps(auVar66,auVar155);
          auVar174._8_4_ = auVar217._8_4_;
          auVar174._0_8_ = auVar217._0_8_;
          auVar174._12_4_ = auVar217._12_4_;
          auVar66 = minps(auVar174,auVar252);
          auVar208._8_4_ = auVar136._8_4_;
          auVar208._0_8_ = auVar136._0_8_;
          auVar208._12_4_ = auVar136._12_4_;
          auVar155 = minps(auVar208,auVar146);
          auVar155 = minps(auVar66,auVar155);
          auVar267 = maxps(auVar252,auVar217);
          auVar66 = maxps(auVar146,auVar136);
          auVar66 = maxps(auVar66,auVar267);
          auVar175._0_4_ = auVar113._4_4_ + auVar113._0_4_ + local_b8;
          auVar175._4_4_ = auVar155._4_4_ + auVar155._0_4_ + local_a8;
          auVar175._8_4_ = auVar113._8_4_ + auVar113._4_4_ + fVar165;
          auVar175._12_4_ = auVar113._12_4_ + auVar155._4_4_ + fVar148;
          fVar57 = auVar156._4_4_ + auVar156._0_4_ + local_b8;
          fVar58 = auVar66._4_4_ + auVar66._0_4_ + local_a8;
          auVar137._4_4_ = fVar58;
          auVar137._0_4_ = fVar57;
          auVar21._4_4_ = local_538._0_4_;
          auVar21._0_4_ = fVar89;
          auVar21._8_4_ = fVar90;
          auVar21._12_4_ = fStack_51c;
          auVar155 = maxps(auVar21,auVar175);
          auVar137._8_4_ = auVar156._8_4_ + auVar156._4_4_ + fVar165;
          auVar137._12_4_ = auVar156._12_4_ + auVar66._4_4_ + fVar148;
          auVar66 = minps(auVar137,auVar162);
          iVar45 = -(uint)(auVar66._0_4_ < auVar155._0_4_);
          iVar53 = -(uint)(auVar66._4_4_ < auVar155._4_4_);
          auVar139._4_4_ = iVar53;
          auVar139._0_4_ = iVar45;
          auVar139._8_4_ = iVar53;
          auVar139._12_4_ = iVar53;
          auVar138._8_8_ = auVar139._8_8_;
          auVar138._4_4_ = iVar45;
          auVar138._0_4_ = iVar45;
          uVar55 = movmskpd((int)pRVar48,auVar138);
          pRVar48 = (RTCIntersectArguments *)(ulong)uVar55;
          fStack_520 = fVar90;
          if (uVar55 == 0) {
            pRVar48 = (RTCIntersectArguments *)0x0;
            if ((fVar89 < auVar175._0_4_) && (fVar57 < fVar90)) {
              iVar45 = -(uint)(fVar58 < fStack_51c);
              pRVar48 = (RTCIntersectArguments *)
                        (ulong)CONCAT11((char)((uint)iVar45 >> 8),
                                        (byte)iVar45 & (float)local_538._0_4_ < auVar175._4_4_);
            }
            bVar39 = bVar38 | (byte)pRVar48;
            uVar41 = (ulong)CONCAT31(uVar15,bVar39);
            if (bVar39 == 1) {
              uVar41 = 200;
              do {
                fVar58 = 1.0 - local_b8;
                fVar91 = local_b8 * local_b8 * local_b8;
                fVar90 = local_b8 * local_b8 * 3.0 * fVar58;
                fVar57 = fVar58 * fVar58 * fVar58;
                fVar148 = local_b8 * 3.0 * fVar58 * fVar58;
                fVar58 = fVar57 * fVar107 +
                         fVar148 * fVar197 + fVar90 * fVar178 + fVar91 * (float)local_388._0_4_;
                fVar89 = fVar57 * fVar126 +
                         fVar148 * fVar198 + fVar90 * fVar196 + fVar91 * (float)local_388._4_4_;
                fVar58 = ((fVar57 * fVar140 +
                          fVar148 * fVar164 + fVar90 * fVar149 + fVar91 * fStack_380) - fVar58) *
                         local_a8 + fVar58;
                fVar89 = ((fVar57 * fVar141 +
                          fVar148 * fVar128 + fVar90 * fVar163 + fVar91 * fStack_37c) - fVar89) *
                         local_a8 + fVar89;
                local_b8 = local_b8 - (fVar89 * fVar176 + fVar58 * fVar211);
                local_a8 = local_a8 - (fVar89 * fVar210 + fVar58 * fVar218);
                fVar57 = ABS(fVar89);
                if (ABS(fVar89) <= ABS(fVar58)) {
                  fVar57 = ABS(fVar58);
                }
                if (fVar57 < local_148) {
                  if ((((local_b8 < 0.0) || (1.0 < local_b8)) || (local_a8 < 0.0)) ||
                     (1.0 < local_a8)) break;
                  fVar57 = (pLVar50->vx).field_0.m128[2];
                  fVar58 = (pLVar50->vy).field_0.m128[2];
                  fVar89 = (pLVar50->vz).field_0.m128[2];
                  fVar177 = 1.0 - local_a8;
                  fVar176 = 1.0 - local_b8;
                  fVar90 = fVar176 * fVar176 * fVar176;
                  fVar91 = local_b8 * 3.0 * fVar176 * fVar176;
                  fVar165 = local_b8 * local_b8 * local_b8;
                  fVar148 = local_b8 * local_b8 * 3.0 * fVar176;
                  fVar57 = ((fStack_150 * fVar89 + fStack_154 * fVar58 + local_158 * fVar57) *
                            fVar177 +
                           (fStack_190 * fVar89 + fStack_194 * fVar58 + local_198 * fVar57) *
                           local_a8) * fVar90 +
                           ((fStack_160 * fVar89 + fStack_164 * fVar58 + local_168 * fVar57) *
                            fVar177 +
                           (fStack_1a0 * fVar89 + fStack_1a4 * fVar58 + local_1a8 * fVar57) *
                           local_a8) * fVar91 +
                           ((fStack_170 * fVar89 + fStack_174 * fVar58 + local_178 * fVar57) *
                            fVar177 +
                           (fStack_1b0 * fVar89 + fStack_1b4 * fVar58 + local_1b8 * fVar57) *
                           local_a8) * fVar148 +
                           (fVar177 * (fStack_180 * fVar89 +
                                      fStack_184 * fVar58 + local_188 * fVar57) +
                           (fVar89 * fStack_1c0 + fVar58 * fStack_1c4 + fVar57 * local_1c8) *
                           local_a8) * fVar165;
                  if ((fVar57 < fVar127) ||
                     (fVar58 = *(float *)(ray + k * 4 + 0x80), fVar58 < fVar57)) break;
                  fVar210 = 1.0 - local_a8;
                  fVar211 = 1.0 - local_a8;
                  fVar218 = 1.0 - local_a8;
                  fVar89 = local_3d8 * fVar210 + local_288 * local_a8;
                  fVar177 = fStack_3d4 * fVar211 + fStack_284 * local_a8;
                  fVar209 = fStack_3d0 * fVar218 + fStack_280 * local_a8;
                  fVar219 = local_3f8 * fVar210 + fVar93 * local_a8;
                  fVar227 = fStack_3f4 * fVar211 + fVar109 * local_a8;
                  fVar241 = fStack_3f0 * fVar218 + fVar147 * local_a8;
                  fVar225 = fVar219 - fVar89;
                  fVar238 = fVar227 - fVar177;
                  fVar244 = fVar241 - fVar209;
                  fVar89 = (((fVar89 - (local_3c8 * fVar210 + local_3b8 * local_a8)) * fVar176 +
                            local_b8 * fVar225) * fVar176 +
                           (fVar225 * fVar176 +
                           ((fVar210 * local_3e8 + fVar92 * local_a8) - fVar219) * local_b8) *
                           local_b8) * 3.0;
                  fVar177 = (((fVar177 - (fStack_3c4 * fVar211 + fStack_3b4 * local_a8)) * fVar176 +
                             local_b8 * fVar238) * fVar176 +
                            (fVar238 * fVar176 +
                            ((fVar211 * fStack_3e4 + fVar108 * local_a8) - fVar227) * local_b8) *
                            local_b8) * 3.0;
                  fVar176 = (((fVar209 - (fStack_3c0 * fVar218 + fStack_3b0 * local_a8)) * fVar176 +
                             local_b8 * fVar244) * fVar176 +
                            (fVar244 * fVar176 +
                            ((fVar218 * fStack_3e0 + fVar142 * local_a8) - fVar241) * local_b8) *
                            local_b8) * 3.0;
                  pGVar7 = (context->scene->geometries).items[uVar52].ptr;
                  uVar55 = *(uint *)(ray + k * 4 + 0x90);
                  pLVar50 = local_508;
                  if ((pGVar7->mask & uVar55) != 0) {
                    fVar209 = fVar90 * local_298 +
                              fVar91 * local_2a8 + fVar148 * local_2b8 + fVar165 * local_2c8;
                    fVar210 = fVar90 * fStack_294 +
                              fVar91 * fStack_2a4 + fVar148 * fStack_2b4 + fVar165 * fStack_2c4;
                    fVar90 = fVar90 * fStack_290 +
                             fVar91 * fStack_2a0 + fVar148 * fStack_2b0 + fVar165 * fStack_2c0;
                    local_c8 = fVar210 * fVar89 - fVar177 * fVar209;
                    local_e8._0_4_ = fVar90 * fVar177 - fVar176 * fVar210;
                    local_d8 = fVar209 * fVar176 - fVar89 * fVar90;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_e8._4_4_ = local_e8._0_4_;
                      local_e8._8_4_ = local_e8._0_4_;
                      fStack_dc = (float)local_e8._0_4_;
                      fStack_d4 = local_d8;
                      fStack_d0 = local_d8;
                      fStack_cc = local_d8;
                      fStack_c4 = local_c8;
                      fStack_c0 = local_c8;
                      fStack_bc = local_c8;
                      fStack_b4 = local_b8;
                      fStack_b0 = local_b8;
                      fStack_ac = local_b8;
                      fStack_a4 = local_a8;
                      fStack_a0 = local_a8;
                      fStack_9c = local_a8;
                      local_98 = CONCAT44(uStack_2f4,local_2f8);
                      uStack_90 = CONCAT44(uStack_2ec,uStack_2f0);
                      local_88 = CONCAT44(uStack_2e4,local_2e8);
                      uStack_80 = CONCAT44(uStack_2dc,uStack_2e0);
                      pRVar48 = &local_78;
                      local_78.flags = context->user->instID[0];
                      local_78.feature_mask = local_78.flags;
                      local_78.context._0_4_ = local_78.flags;
                      local_78.context._4_4_ = local_78.flags;
                      local_78.filter._0_4_ = context->user->instPrimID[0];
                      local_78.filter._4_4_ = (uint)local_78.filter;
                      local_78.intersect._0_4_ = (uint)local_78.filter;
                      local_78.intersect._4_4_ = (uint)local_78.filter;
                      *(float *)(ray + k * 4 + 0x80) = fVar57;
                      local_458 = *local_440;
                      uStack_450 = local_440[1];
                      local_428.valid = (int *)&local_458;
                      local_428.geometryUserPtr = pGVar7->userPtr;
                      local_428.context = context->user;
                      local_428.hit = (RTCHitN *)local_e8;
                      local_428.N = 4;
                      p_Var43 = pGVar7->intersectionFilterN;
                      local_428.ray = (RTCRayN *)ray;
                      if (p_Var43 != (RTCFilterFunctionN)0x0) {
                        p_Var43 = (RTCFilterFunctionN)(*p_Var43)(&local_428);
                      }
                      auVar85._0_4_ = -(uint)((int)local_458 == 0);
                      auVar85._4_4_ = -(uint)(local_458._4_4_ == 0);
                      auVar85._8_4_ = -(uint)((int)uStack_450 == 0);
                      auVar85._12_4_ = -(uint)(uStack_450._4_4_ == 0);
                      uVar55 = movmskps((int)p_Var43,auVar85);
                      pRVar44 = (RayHitK<4> *)(ulong)(uVar55 ^ 0xf);
                      if ((uVar55 ^ 0xf) == 0) {
                        auVar85 = auVar85 ^ _DAT_01febe20;
                      }
                      else {
                        pRVar48 = context->args;
                        p_Var43 = pRVar48->filter;
                        if ((p_Var43 != (RTCFilterFunctionN)0x0) &&
                           (((pRVar48->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          p_Var43 = (RTCFilterFunctionN)(*p_Var43)(&local_428);
                        }
                        auVar105._0_4_ = -(uint)((int)local_458 == 0);
                        auVar105._4_4_ = -(uint)(local_458._4_4_ == 0);
                        auVar105._8_4_ = -(uint)((int)uStack_450 == 0);
                        auVar105._12_4_ = -(uint)(uStack_450._4_4_ == 0);
                        auVar85 = auVar105 ^ _DAT_01febe20;
                        uVar55 = movmskps((int)p_Var43,auVar105);
                        pRVar44 = (RayHitK<4> *)(ulong)(uVar55 ^ 0xf);
                        if ((uVar55 ^ 0xf) != 0) {
                          RVar20 = *(RTCFeatureFlags *)((long)local_428.hit + 4);
                          uVar55 = *(uint *)((long)local_428.hit + 8);
                          uVar49 = *(uint *)((long)((long)local_428.hit + 8) + 4);
                          *(RTCRayQueryFlags *)(local_428.ray + 0xc0) =
                               ~auVar105._0_4_ & *(RTCRayQueryFlags *)&(local_428.hit)->field_0x0 |
                               *(RTCRayQueryFlags *)(local_428.ray + 0xc0) & auVar105._0_4_;
                          *(RTCFeatureFlags *)(local_428.ray + 0xc4) =
                               ~auVar105._4_4_ & RVar20 |
                               *(RTCFeatureFlags *)(local_428.ray + 0xc4) & auVar105._4_4_;
                          *(uint *)(local_428.ray + 200) =
                               ~auVar105._8_4_ & uVar55 |
                               *(uint *)(local_428.ray + 200) & auVar105._8_4_;
                          *(uint *)(local_428.ray + 0xcc) =
                               ~auVar105._12_4_ & uVar49 |
                               *(uint *)(local_428.ray + 0xcc) & auVar105._12_4_;
                          RVar20 = *(RTCFeatureFlags *)((long)((long)local_428.hit + 0x10) + 4);
                          uVar55 = *(uint *)((long)local_428.hit + 0x18);
                          uVar49 = *(uint *)((long)((long)local_428.hit + 0x18) + 4);
                          *(RTCRayQueryFlags *)(local_428.ray + 0xd0) =
                               ~auVar105._0_4_ & *(RTCRayQueryFlags *)((long)local_428.hit + 0x10) |
                               *(RTCRayQueryFlags *)(local_428.ray + 0xd0) & auVar105._0_4_;
                          *(RTCFeatureFlags *)(local_428.ray + 0xd4) =
                               ~auVar105._4_4_ & RVar20 |
                               *(RTCFeatureFlags *)(local_428.ray + 0xd4) & auVar105._4_4_;
                          *(uint *)(local_428.ray + 0xd8) =
                               ~auVar105._8_4_ & uVar55 |
                               *(uint *)(local_428.ray + 0xd8) & auVar105._8_4_;
                          *(uint *)(local_428.ray + 0xdc) =
                               ~auVar105._12_4_ & uVar49 |
                               *(uint *)(local_428.ray + 0xdc) & auVar105._12_4_;
                          RVar20 = ((RTCIntersectArguments *)((long)local_428.hit + 0x20))->
                                   feature_mask;
                          uVar55 = *(uint *)&((RTCIntersectArguments *)((long)local_428.hit + 0x20))
                                             ->context;
                          uVar49 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_428.hit + 0x20))->context + 4);
                          *(RTCRayQueryFlags *)(local_428.ray + 0xe0) =
                               ~auVar105._0_4_ &
                               ((RTCIntersectArguments *)((long)local_428.hit + 0x20))->flags |
                               *(RTCRayQueryFlags *)(local_428.ray + 0xe0) & auVar105._0_4_;
                          *(RTCFeatureFlags *)(local_428.ray + 0xe4) =
                               ~auVar105._4_4_ & RVar20 |
                               *(RTCFeatureFlags *)(local_428.ray + 0xe4) & auVar105._4_4_;
                          *(uint *)(local_428.ray + 0xe8) =
                               ~auVar105._8_4_ & uVar55 |
                               *(uint *)(local_428.ray + 0xe8) & auVar105._8_4_;
                          *(uint *)(local_428.ray + 0xec) =
                               ~auVar105._12_4_ & uVar49 |
                               *(uint *)(local_428.ray + 0xec) & auVar105._12_4_;
                          RVar20 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_428.hit + 0x20))
                                            ->filter + 4);
                          uVar55 = *(uint *)&((RTCIntersectArguments *)((long)local_428.hit + 0x20))
                                             ->intersect;
                          uVar49 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_428.hit + 0x20))->intersect + 4);
                          *(RTCRayQueryFlags *)(local_428.ray + 0xf0) =
                               ~auVar105._0_4_ &
                               *(RTCRayQueryFlags *)
                                &((RTCIntersectArguments *)((long)local_428.hit + 0x20))->filter |
                               *(RTCRayQueryFlags *)(local_428.ray + 0xf0) & auVar105._0_4_;
                          *(RTCFeatureFlags *)(local_428.ray + 0xf4) =
                               ~auVar105._4_4_ & RVar20 |
                               *(RTCFeatureFlags *)(local_428.ray + 0xf4) & auVar105._4_4_;
                          *(uint *)(local_428.ray + 0xf8) =
                               ~auVar105._8_4_ & uVar55 |
                               *(uint *)(local_428.ray + 0xf8) & auVar105._8_4_;
                          *(uint *)(local_428.ray + 0xfc) =
                               ~auVar105._12_4_ & uVar49 |
                               *(uint *)(local_428.ray + 0xfc) & auVar105._12_4_;
                          RVar20 = ((RTCIntersectArguments *)((long)local_428.hit + 0x40))->
                                   feature_mask;
                          uVar55 = *(uint *)&((RTCIntersectArguments *)((long)local_428.hit + 0x40))
                                             ->context;
                          uVar49 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_428.hit + 0x40))->context + 4);
                          *(RTCRayQueryFlags *)(local_428.ray + 0x100) =
                               ~auVar105._0_4_ &
                               ((RTCIntersectArguments *)((long)local_428.hit + 0x40))->flags |
                               *(RTCRayQueryFlags *)(local_428.ray + 0x100) & auVar105._0_4_;
                          *(RTCFeatureFlags *)(local_428.ray + 0x104) =
                               ~auVar105._4_4_ & RVar20 |
                               *(RTCFeatureFlags *)(local_428.ray + 0x104) & auVar105._4_4_;
                          *(uint *)(local_428.ray + 0x108) =
                               ~auVar105._8_4_ & uVar55 |
                               *(uint *)(local_428.ray + 0x108) & auVar105._8_4_;
                          *(uint *)(local_428.ray + 0x10c) =
                               ~auVar105._12_4_ & uVar49 |
                               *(uint *)(local_428.ray + 0x10c) & auVar105._12_4_;
                          RVar20 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_428.hit + 0x40))
                                            ->filter + 4);
                          uVar55 = *(uint *)&((RTCIntersectArguments *)((long)local_428.hit + 0x40))
                                             ->intersect;
                          uVar49 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_428.hit + 0x40))->intersect + 4);
                          *(RTCRayQueryFlags *)(local_428.ray + 0x110) =
                               *(RTCRayQueryFlags *)(local_428.ray + 0x110) & auVar105._0_4_ |
                               ~auVar105._0_4_ &
                               *(RTCRayQueryFlags *)
                                &((RTCIntersectArguments *)((long)local_428.hit + 0x40))->filter;
                          *(RTCFeatureFlags *)(local_428.ray + 0x114) =
                               *(RTCFeatureFlags *)(local_428.ray + 0x114) & auVar105._4_4_ |
                               ~auVar105._4_4_ & RVar20;
                          *(uint *)(local_428.ray + 0x118) =
                               *(uint *)(local_428.ray + 0x118) & auVar105._8_4_ |
                               ~auVar105._8_4_ & uVar55;
                          *(uint *)(local_428.ray + 0x11c) =
                               *(uint *)(local_428.ray + 0x11c) & auVar105._12_4_ |
                               ~auVar105._12_4_ & uVar49;
                          RVar20 = ((RTCIntersectArguments *)((long)local_428.hit + 0x60))->
                                   feature_mask;
                          uVar55 = *(uint *)&((RTCIntersectArguments *)((long)local_428.hit + 0x60))
                                             ->context;
                          uVar49 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_428.hit + 0x60))->context + 4);
                          *(RTCRayQueryFlags *)(local_428.ray + 0x120) =
                               *(RTCRayQueryFlags *)(local_428.ray + 0x120) & auVar105._0_4_ |
                               ~auVar105._0_4_ &
                               ((RTCIntersectArguments *)((long)local_428.hit + 0x60))->flags;
                          *(RTCFeatureFlags *)(local_428.ray + 0x124) =
                               *(RTCFeatureFlags *)(local_428.ray + 0x124) & auVar105._4_4_ |
                               ~auVar105._4_4_ & RVar20;
                          *(uint *)(local_428.ray + 0x128) =
                               *(uint *)(local_428.ray + 0x128) & auVar105._8_4_ |
                               ~auVar105._8_4_ & uVar55;
                          *(uint *)(local_428.ray + 300) =
                               *(uint *)(local_428.ray + 300) & auVar105._12_4_ |
                               ~auVar105._12_4_ & uVar49;
                          RVar20 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_428.hit + 0x60))
                                            ->filter + 4);
                          uVar55 = *(uint *)&((RTCIntersectArguments *)((long)local_428.hit + 0x60))
                                             ->intersect;
                          uVar49 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_428.hit + 0x60))->intersect + 4);
                          *(RTCRayQueryFlags *)(local_428.ray + 0x130) =
                               ~auVar105._0_4_ &
                               *(RTCRayQueryFlags *)
                                &((RTCIntersectArguments *)((long)local_428.hit + 0x60))->filter |
                               *(RTCRayQueryFlags *)(local_428.ray + 0x130) & auVar105._0_4_;
                          *(RTCFeatureFlags *)(local_428.ray + 0x134) =
                               ~auVar105._4_4_ & RVar20 |
                               *(RTCFeatureFlags *)(local_428.ray + 0x134) & auVar105._4_4_;
                          *(uint *)(local_428.ray + 0x138) =
                               ~auVar105._8_4_ & uVar55 |
                               *(uint *)(local_428.ray + 0x138) & auVar105._8_4_;
                          *(uint *)(local_428.ray + 0x13c) =
                               ~auVar105._12_4_ & uVar49 |
                               *(uint *)(local_428.ray + 0x13c) & auVar105._12_4_;
                          RVar20 = ((RTCIntersectArguments *)((long)local_428.hit + 0x80))->
                                   feature_mask;
                          uVar55 = *(uint *)&((RTCIntersectArguments *)((long)local_428.hit + 0x80))
                                             ->context;
                          uVar49 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_428.hit + 0x80))->context + 4);
                          *(RTCRayQueryFlags *)(local_428.ray + 0x140) =
                               ~auVar105._0_4_ &
                               ((RTCIntersectArguments *)((long)local_428.hit + 0x80))->flags |
                               *(RTCRayQueryFlags *)(local_428.ray + 0x140) & auVar105._0_4_;
                          *(RTCFeatureFlags *)(local_428.ray + 0x144) =
                               ~auVar105._4_4_ & RVar20 |
                               *(RTCFeatureFlags *)(local_428.ray + 0x144) & auVar105._4_4_;
                          *(uint *)(local_428.ray + 0x148) =
                               ~auVar105._8_4_ & uVar55 |
                               *(uint *)(local_428.ray + 0x148) & auVar105._8_4_;
                          *(uint *)(local_428.ray + 0x14c) =
                               ~auVar105._12_4_ & uVar49 |
                               *(uint *)(local_428.ray + 0x14c) & auVar105._12_4_;
                          pRVar44 = (RayHitK<4> *)local_428.ray;
                          pRVar48 = (RTCIntersectArguments *)local_428.hit;
                        }
                      }
                      auVar86._0_4_ = auVar85._0_4_ << 0x1f;
                      auVar86._4_4_ = auVar85._4_4_ << 0x1f;
                      auVar86._8_4_ = auVar85._8_4_ << 0x1f;
                      auVar86._12_4_ = auVar85._12_4_ << 0x1f;
                      uVar55 = movmskps((int)pRVar44,auVar86);
                      uVar41 = (ulong)uVar55;
                      if (uVar55 == 0) {
                        *(float *)(ray + k * 4 + 0x80) = fVar58;
                      }
                      break;
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar57;
                    *(undefined4 *)(ray + k * 4 + 0xc0) = local_e8._0_4_;
                    *(float *)(ray + k * 4 + 0xd0) = local_d8;
                    *(float *)(ray + k * 4 + 0xe0) = local_c8;
                    *(float *)(ray + k * 4 + 0xf0) = local_b8;
                    *(float *)(ray + k * 4 + 0x100) = local_a8;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_438;
                    *(uint *)(ray + k * 4 + 0x120) = uVar52;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar55 = context->user->instPrimID[0];
                    *(uint *)(ray + k * 4 + 0x140) = uVar55;
                  }
                  uVar41 = (ulong)uVar55;
                  pRVar48 = (RTCIntersectArguments *)k;
                  break;
                }
                uVar41 = uVar41 - 1;
              } while (uVar41 != 0);
            }
            else {
              bVar18 = false;
            }
          }
        }
      }
    } while (bVar18);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }